

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  byte bVar84;
  byte bVar85;
  ulong uVar86;
  uint uVar87;
  long lVar88;
  long lVar89;
  Geometry *pGVar90;
  uint uVar91;
  ulong uVar92;
  byte bVar93;
  float fVar94;
  float fVar95;
  float fVar146;
  float fVar148;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar152;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined4 uVar153;
  undefined8 uVar154;
  vint4 bi_2;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  vint4 bi_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  vint4 bi;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar182;
  float fVar190;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  float fVar191;
  float fVar192;
  float fVar201;
  float fVar203;
  vint4 ai_2;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar204;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar202;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  vint4 ai_1;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  vint4 ai;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [64];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  undefined8 local_770;
  undefined8 uStack_768;
  RTCFilterFunctionNArguments local_760;
  Geometry *local_730;
  undefined1 (*local_728) [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined8 uStack_578;
  LinearSpace3fa *local_570;
  Primitive *local_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_400;
  int local_3fc;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  byte local_3b0;
  float local_3a0 [4];
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  int local_260;
  int iStack_25c;
  int iStack_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int iStack_248;
  int iStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar86 = (ulong)(byte)PVar6;
  lVar30 = uVar86 * 0x25;
  fVar192 = *(float *)(prim + lVar30 + 0x12);
  auVar100 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar100 = vinsertps_avx(auVar100,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar99 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar100 = vsubps_avx(auVar100,*(undefined1 (*) [16])(prim + lVar30 + 6));
  auVar183._0_4_ = fVar192 * auVar100._0_4_;
  auVar183._4_4_ = fVar192 * auVar100._4_4_;
  auVar183._8_4_ = fVar192 * auVar100._8_4_;
  auVar183._12_4_ = fVar192 * auVar100._12_4_;
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 4 + 6)));
  auVar155._0_4_ = fVar192 * auVar99._0_4_;
  auVar155._4_4_ = fVar192 * auVar99._4_4_;
  auVar155._8_4_ = fVar192 * auVar99._8_4_;
  auVar155._12_4_ = fVar192 * auVar99._12_4_;
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 5 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xf + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar86 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1a + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1b + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1c + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar205._4_4_ = auVar155._0_4_;
  auVar205._0_4_ = auVar155._0_4_;
  auVar205._8_4_ = auVar155._0_4_;
  auVar205._12_4_ = auVar155._0_4_;
  auVar26 = vshufps_avx(auVar155,auVar155,0x55);
  auVar102 = vshufps_avx(auVar155,auVar155,0xaa);
  fVar192 = auVar102._0_4_;
  auVar173._0_4_ = fVar192 * auVar101._0_4_;
  fVar202 = auVar102._4_4_;
  auVar173._4_4_ = fVar202 * auVar101._4_4_;
  fVar191 = auVar102._8_4_;
  auVar173._8_4_ = fVar191 * auVar101._8_4_;
  fVar201 = auVar102._12_4_;
  auVar173._12_4_ = fVar201 * auVar101._12_4_;
  auVar169._0_4_ = auVar22._0_4_ * fVar192;
  auVar169._4_4_ = auVar22._4_4_ * fVar202;
  auVar169._8_4_ = auVar22._8_4_ * fVar191;
  auVar169._12_4_ = auVar22._12_4_ * fVar201;
  auVar156._0_4_ = auVar25._0_4_ * fVar192;
  auVar156._4_4_ = auVar25._4_4_ * fVar202;
  auVar156._8_4_ = auVar25._8_4_ * fVar191;
  auVar156._12_4_ = auVar25._12_4_ * fVar201;
  auVar102 = vfmadd231ps_fma(auVar173,auVar26,auVar99);
  auVar103 = vfmadd231ps_fma(auVar169,auVar26,auVar21);
  auVar26 = vfmadd231ps_fma(auVar156,auVar24,auVar26);
  auVar32 = vfmadd231ps_fma(auVar102,auVar205,auVar100);
  auVar103 = vfmadd231ps_fma(auVar103,auVar205,auVar20);
  auVar104 = vfmadd231ps_fma(auVar26,auVar23,auVar205);
  auVar229._4_4_ = auVar183._0_4_;
  auVar229._0_4_ = auVar183._0_4_;
  auVar229._8_4_ = auVar183._0_4_;
  auVar229._12_4_ = auVar183._0_4_;
  auVar26 = vshufps_avx(auVar183,auVar183,0x55);
  auVar102 = vshufps_avx(auVar183,auVar183,0xaa);
  fVar192 = auVar102._0_4_;
  auVar206._0_4_ = fVar192 * auVar101._0_4_;
  fVar202 = auVar102._4_4_;
  auVar206._4_4_ = fVar202 * auVar101._4_4_;
  fVar191 = auVar102._8_4_;
  auVar206._8_4_ = fVar191 * auVar101._8_4_;
  fVar201 = auVar102._12_4_;
  auVar206._12_4_ = fVar201 * auVar101._12_4_;
  auVar193._0_4_ = auVar22._0_4_ * fVar192;
  auVar193._4_4_ = auVar22._4_4_ * fVar202;
  auVar193._8_4_ = auVar22._8_4_ * fVar191;
  auVar193._12_4_ = auVar22._12_4_ * fVar201;
  auVar184._0_4_ = auVar25._0_4_ * fVar192;
  auVar184._4_4_ = auVar25._4_4_ * fVar202;
  auVar184._8_4_ = auVar25._8_4_ * fVar191;
  auVar184._12_4_ = auVar25._12_4_ * fVar201;
  auVar99 = vfmadd231ps_fma(auVar206,auVar26,auVar99);
  auVar101 = vfmadd231ps_fma(auVar193,auVar26,auVar21);
  auVar21 = vfmadd231ps_fma(auVar184,auVar26,auVar24);
  auVar33 = vfmadd231ps_fma(auVar99,auVar229,auVar100);
  auVar155 = vfmadd231ps_fma(auVar101,auVar229,auVar20);
  auVar221._8_4_ = 0x7fffffff;
  auVar221._0_8_ = 0x7fffffff7fffffff;
  auVar221._12_4_ = 0x7fffffff;
  auVar156 = vfmadd231ps_fma(auVar21,auVar229,auVar23);
  auVar100 = vandps_avx(auVar221,auVar32);
  auVar218._8_4_ = 0x219392ef;
  auVar218._0_8_ = 0x219392ef219392ef;
  auVar218._12_4_ = 0x219392ef;
  uVar92 = vcmpps_avx512vl(auVar100,auVar218,1);
  bVar13 = (bool)((byte)uVar92 & 1);
  auVar96._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar32._0_4_;
  bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar32._4_4_;
  bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar32._8_4_;
  bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar32._12_4_;
  auVar100 = vandps_avx(auVar221,auVar103);
  uVar92 = vcmpps_avx512vl(auVar100,auVar218,1);
  bVar13 = (bool)((byte)uVar92 & 1);
  auVar97._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._0_4_;
  bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._4_4_;
  bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._8_4_;
  bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar103._12_4_;
  auVar100 = vandps_avx(auVar221,auVar104);
  uVar92 = vcmpps_avx512vl(auVar100,auVar218,1);
  bVar13 = (bool)((byte)uVar92 & 1);
  auVar98._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar104._0_4_;
  bVar13 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar104._4_4_;
  bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar104._8_4_;
  bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar104._12_4_;
  auVar99 = vrcp14ps_avx512vl(auVar96);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = &DAT_3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar100 = vfnmadd213ps_fma(auVar96,auVar99,auVar219);
  auVar32 = vfmadd132ps_fma(auVar100,auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar97);
  auVar100 = vfnmadd213ps_fma(auVar97,auVar99,auVar219);
  auVar104 = vfmadd132ps_fma(auVar100,auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar98);
  auVar100 = vfnmadd213ps_fma(auVar98,auVar99,auVar219);
  auVar31 = vfmadd132ps_fma(auVar100,auVar99,auVar99);
  fVar192 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar30 + 0x16)) *
            *(float *)(prim + lVar30 + 0x1a);
  auVar216._4_4_ = fVar192;
  auVar216._0_4_ = fVar192;
  auVar216._8_4_ = fVar192;
  auVar216._12_4_ = fVar192;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar86 * 7 + 6);
  auVar100 = vpmovsxwd_avx(auVar100);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar86 * 0xb + 6);
  auVar99 = vpmovsxwd_avx(auVar99);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar20 = vsubps_avx(auVar99,auVar100);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar86 * 9 + 6);
  auVar99 = vpmovsxwd_avx(auVar101);
  auVar101 = vfmadd213ps_fma(auVar20,auVar216,auVar100);
  auVar100 = vcvtdq2ps_avx(auVar99);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar86 * 0xd + 6);
  auVar99 = vpmovsxwd_avx(auVar20);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar100);
  auVar20 = vfmadd213ps_fma(auVar99,auVar216,auVar100);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar86 * 0x12 + 6);
  auVar100 = vpmovsxwd_avx(auVar21);
  auVar100 = vcvtdq2ps_avx(auVar100);
  uVar92 = (ulong)(uint)((int)(uVar86 * 5) << 2);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar86 * 2 + uVar92 + 6);
  auVar99 = vpmovsxwd_avx(auVar22);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar100);
  auVar21 = vfmadd213ps_fma(auVar99,auVar216,auVar100);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar92 + 6);
  auVar100 = vpmovsxwd_avx(auVar23);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar86 * 0x18 + 6);
  auVar99 = vpmovsxwd_avx(auVar24);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar100);
  auVar22 = vfmadd213ps_fma(auVar99,auVar216,auVar100);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar86 * 0x1d + 6);
  auVar100 = vpmovsxwd_avx(auVar25);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar86 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar99 = vpmovsxwd_avx(auVar26);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar100);
  auVar23 = vfmadd213ps_fma(auVar99,auVar216,auVar100);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar86) + 6);
  auVar100 = vpmovsxwd_avx(auVar102);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar86 * 0x23 + 6);
  auVar99 = vpmovsxwd_avx(auVar103);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar100);
  auVar99 = vfmadd213ps_fma(auVar99,auVar216,auVar100);
  auVar100 = vsubps_avx(auVar101,auVar33);
  auVar217._0_4_ = auVar32._0_4_ * auVar100._0_4_;
  auVar217._4_4_ = auVar32._4_4_ * auVar100._4_4_;
  auVar217._8_4_ = auVar32._8_4_ * auVar100._8_4_;
  auVar217._12_4_ = auVar32._12_4_ * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar20,auVar33);
  auVar174._0_4_ = auVar32._0_4_ * auVar100._0_4_;
  auVar174._4_4_ = auVar32._4_4_ * auVar100._4_4_;
  auVar174._8_4_ = auVar32._8_4_ * auVar100._8_4_;
  auVar174._12_4_ = auVar32._12_4_ * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar21,auVar155);
  auVar207._0_4_ = auVar104._0_4_ * auVar100._0_4_;
  auVar207._4_4_ = auVar104._4_4_ * auVar100._4_4_;
  auVar207._8_4_ = auVar104._8_4_ * auVar100._8_4_;
  auVar207._12_4_ = auVar104._12_4_ * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar22,auVar155);
  auVar170._0_4_ = auVar104._0_4_ * auVar100._0_4_;
  auVar170._4_4_ = auVar104._4_4_ * auVar100._4_4_;
  auVar170._8_4_ = auVar104._8_4_ * auVar100._8_4_;
  auVar170._12_4_ = auVar104._12_4_ * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar23,auVar156);
  auVar194._0_4_ = auVar31._0_4_ * auVar100._0_4_;
  auVar194._4_4_ = auVar31._4_4_ * auVar100._4_4_;
  auVar194._8_4_ = auVar31._8_4_ * auVar100._8_4_;
  auVar194._12_4_ = auVar31._12_4_ * auVar100._12_4_;
  auVar100 = vsubps_avx(auVar99,auVar156);
  auVar157._0_4_ = auVar31._0_4_ * auVar100._0_4_;
  auVar157._4_4_ = auVar31._4_4_ * auVar100._4_4_;
  auVar157._8_4_ = auVar31._8_4_ * auVar100._8_4_;
  auVar157._12_4_ = auVar31._12_4_ * auVar100._12_4_;
  auVar100 = vpminsd_avx(auVar217,auVar174);
  auVar99 = vpminsd_avx(auVar207,auVar170);
  auVar100 = vmaxps_avx(auVar100,auVar99);
  auVar99 = vpminsd_avx(auVar194,auVar157);
  uVar153 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar32._4_4_ = uVar153;
  auVar32._0_4_ = uVar153;
  auVar32._8_4_ = uVar153;
  auVar32._12_4_ = uVar153;
  auVar99 = vmaxps_avx512vl(auVar99,auVar32);
  auVar100 = vmaxps_avx(auVar100,auVar99);
  auVar104._8_4_ = 0x3f7ffffa;
  auVar104._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar104._12_4_ = 0x3f7ffffa;
  local_2b0 = vmulps_avx512vl(auVar100,auVar104);
  auVar100 = vpmaxsd_avx(auVar217,auVar174);
  auVar99 = vpmaxsd_avx(auVar207,auVar170);
  auVar100 = vminps_avx(auVar100,auVar99);
  auVar99 = vpmaxsd_avx(auVar194,auVar157);
  uVar153 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar31._4_4_ = uVar153;
  auVar31._0_4_ = uVar153;
  auVar31._8_4_ = uVar153;
  auVar31._12_4_ = uVar153;
  auVar99 = vminps_avx512vl(auVar99,auVar31);
  auVar100 = vminps_avx(auVar100,auVar99);
  auVar33._8_4_ = 0x3f800003;
  auVar33._0_8_ = 0x3f8000033f800003;
  auVar33._12_4_ = 0x3f800003;
  auVar100 = vmulps_avx512vl(auVar100,auVar33);
  auVar99 = vpbroadcastd_avx512vl();
  uVar154 = vcmpps_avx512vl(local_2b0,auVar100,2);
  uVar92 = vpcmpgtd_avx512vl(auVar99,_DAT_01ff0cf0);
  uVar92 = ((byte)uVar154 & 0xf) & uVar92;
  if ((char)uVar92 != '\0') {
    local_570 = pre->ray_space + k;
    local_728 = (undefined1 (*) [32])&local_180;
    local_280 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_568 = prim;
    do {
      lVar30 = 0;
      for (uVar86 = uVar92; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar91 = *(uint *)(local_568 + 2);
      uVar7 = *(uint *)(local_568 + lVar30 * 4 + 6);
      pGVar90 = (context->scene->geometries).items[uVar91].ptr;
      uVar86 = (ulong)*(uint *)(*(long *)&pGVar90->field_0x58 +
                               (ulong)uVar7 *
                               pGVar90[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar192 = (pGVar90->time_range).lower;
      fVar192 = pGVar90->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar192) /
                ((pGVar90->time_range).upper - fVar192));
      auVar100 = vroundss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),9);
      auVar100 = vminss_avx(auVar100,ZEXT416((uint)(pGVar90->fnumTimeSegments + -1.0)));
      auVar100 = vmaxss_avx(ZEXT816(0) << 0x20,auVar100);
      fVar192 = fVar192 - auVar100._0_4_;
      _Var10 = pGVar90[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar89 = (long)(int)auVar100._0_4_ * 0x38;
      lVar30 = *(long *)(_Var10 + 0x10 + lVar89);
      lVar88 = *(long *)(_Var10 + 0x38 + lVar89);
      lVar11 = *(long *)(_Var10 + 0x48 + lVar89);
      auVar171._4_4_ = fVar192;
      auVar171._0_4_ = fVar192;
      auVar171._8_4_ = fVar192;
      auVar171._12_4_ = fVar192;
      pfVar3 = (float *)(lVar88 + uVar86 * lVar11);
      auVar222._0_4_ = fVar192 * *pfVar3;
      auVar222._4_4_ = fVar192 * pfVar3[1];
      auVar222._8_4_ = fVar192 * pfVar3[2];
      auVar222._12_4_ = fVar192 * pfVar3[3];
      pfVar3 = (float *)(lVar88 + (uVar86 + 1) * lVar11);
      auVar223._0_4_ = fVar192 * *pfVar3;
      auVar223._4_4_ = fVar192 * pfVar3[1];
      auVar223._8_4_ = fVar192 * pfVar3[2];
      auVar223._12_4_ = fVar192 * pfVar3[3];
      auVar100 = vmulps_avx512vl(auVar171,*(undefined1 (*) [16])(lVar88 + (uVar86 + 2) * lVar11));
      auVar99 = vmulps_avx512vl(auVar171,*(undefined1 (*) [16])(lVar88 + lVar11 * (uVar86 + 3)));
      lVar88 = *(long *)(_Var10 + lVar89);
      fVar192 = 1.0 - fVar192;
      auVar158._4_4_ = fVar192;
      auVar158._0_4_ = fVar192;
      auVar158._8_4_ = fVar192;
      auVar158._12_4_ = fVar192;
      auVar20 = vfmadd231ps_fma(auVar222,auVar158,*(undefined1 (*) [16])(lVar88 + lVar30 * uVar86));
      local_6b0 = vfmadd231ps_fma(auVar223,auVar158,
                                  *(undefined1 (*) [16])(lVar88 + lVar30 * (uVar86 + 1)));
      local_6c0 = vfmadd231ps_avx512vl
                            (auVar100,auVar158,
                             *(undefined1 (*) [16])(lVar88 + lVar30 * (uVar86 + 2)));
      _local_6d0 = vfmadd231ps_avx512vl
                             (auVar99,auVar158,
                              *(undefined1 (*) [16])(lVar88 + lVar30 * (uVar86 + 3)));
      iVar8 = (int)pGVar90[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar100 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      lVar30 = (long)iVar8 * 0x44;
      auVar100 = vinsertps_avx(auVar100,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar101 = vsubps_avx(auVar20,auVar100);
      uVar153 = auVar101._0_4_;
      auVar175._4_4_ = uVar153;
      auVar175._0_4_ = uVar153;
      auVar175._8_4_ = uVar153;
      auVar175._12_4_ = uVar153;
      auVar99 = vshufps_avx(auVar101,auVar101,0x55);
      aVar4 = (local_570->vx).field_0;
      aVar5 = (local_570->vy).field_0;
      fVar192 = (local_570->vz).field_0.m128[0];
      fVar202 = *(float *)((long)&(local_570->vz).field_0 + 4);
      fVar191 = *(float *)((long)&(local_570->vz).field_0 + 8);
      fVar201 = *(float *)((long)&(local_570->vz).field_0 + 0xc);
      auVar101 = vshufps_avx(auVar101,auVar101,0xaa);
      auVar225._0_4_ = fVar192 * auVar101._0_4_;
      auVar225._4_4_ = fVar202 * auVar101._4_4_;
      auVar225._8_4_ = fVar191 * auVar101._8_4_;
      auVar225._12_4_ = fVar201 * auVar101._12_4_;
      auVar99 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar5,auVar99);
      auVar21 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar4,auVar175);
      auVar101 = vsubps_avx(local_6b0,auVar100);
      uVar153 = auVar101._0_4_;
      auVar176._4_4_ = uVar153;
      auVar176._0_4_ = uVar153;
      auVar176._8_4_ = uVar153;
      auVar176._12_4_ = uVar153;
      auVar99 = vshufps_avx(auVar101,auVar101,0x55);
      auVar101 = vshufps_avx(auVar101,auVar101,0xaa);
      auVar226._0_4_ = fVar192 * auVar101._0_4_;
      auVar226._4_4_ = fVar202 * auVar101._4_4_;
      auVar226._8_4_ = fVar191 * auVar101._8_4_;
      auVar226._12_4_ = fVar201 * auVar101._12_4_;
      auVar99 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar5,auVar99);
      auVar22 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar4,auVar176);
      auVar101 = vsubps_avx512vl(local_6c0,auVar100);
      uVar153 = auVar101._0_4_;
      auVar177._4_4_ = uVar153;
      auVar177._0_4_ = uVar153;
      auVar177._8_4_ = uVar153;
      auVar177._12_4_ = uVar153;
      auVar99 = vshufps_avx(auVar101,auVar101,0x55);
      auVar101 = vshufps_avx(auVar101,auVar101,0xaa);
      auVar227._0_4_ = fVar192 * auVar101._0_4_;
      auVar227._4_4_ = fVar202 * auVar101._4_4_;
      auVar227._8_4_ = fVar191 * auVar101._8_4_;
      auVar227._12_4_ = fVar201 * auVar101._12_4_;
      auVar99 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar5,auVar99);
      auVar101 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar4,auVar177);
      auVar99 = vsubps_avx512vl(_local_6d0,auVar100);
      uVar153 = auVar99._0_4_;
      auVar172._4_4_ = uVar153;
      auVar172._0_4_ = uVar153;
      auVar172._8_4_ = uVar153;
      auVar172._12_4_ = uVar153;
      auVar100 = vshufps_avx(auVar99,auVar99,0x55);
      auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
      auVar231._0_4_ = fVar192 * auVar99._0_4_;
      auVar231._4_4_ = fVar202 * auVar99._4_4_;
      auVar231._8_4_ = fVar191 * auVar99._8_4_;
      auVar231._12_4_ = fVar201 * auVar99._12_4_;
      auVar100 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar5,auVar100);
      auVar23 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar4,auVar172);
      auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar30);
      uVar153 = auVar21._0_4_;
      local_500._4_4_ = uVar153;
      local_500._0_4_ = uVar153;
      local_500._8_4_ = uVar153;
      local_500._12_4_ = uVar153;
      local_500._16_4_ = uVar153;
      local_500._20_4_ = uVar153;
      local_500._24_4_ = uVar153;
      local_500._28_4_ = uVar153;
      auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x484);
      auVar105._8_4_ = 1;
      auVar105._0_8_ = 0x100000001;
      auVar105._12_4_ = 1;
      auVar105._16_4_ = 1;
      auVar105._20_4_ = 1;
      auVar105._24_4_ = 1;
      auVar105._28_4_ = 1;
      local_4e0 = vpermps_avx2(auVar105,ZEXT1632(auVar21));
      local_520 = vbroadcastss_avx512vl(auVar22);
      local_700 = vpermps_avx512vl(auVar105,ZEXT1632(auVar22));
      auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x908);
      local_720 = vbroadcastss_avx512vl(auVar101);
      local_5e0 = vpermps_avx512vl(auVar105,ZEXT1632(auVar101));
      auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0xd8c);
      local_600 = vbroadcastss_avx512vl(auVar23);
      auVar241 = ZEXT3264(local_600);
      local_620 = vpermps_avx512vl(auVar105,ZEXT1632(auVar23));
      auVar242 = ZEXT3264(local_620);
      auVar105 = vmulps_avx512vl(local_600,auVar117);
      auVar106 = vmulps_avx512vl(local_620,auVar117);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar118,local_720);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar118,local_5e0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar122,local_520);
      auVar107 = vfmadd231ps_avx512vl(auVar106,auVar122,local_700);
      auVar108 = vfmadd231ps_avx512vl(auVar105,auVar120,local_500);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar30);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x484);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x908);
      auVar109 = vfmadd231ps_avx512vl(auVar107,auVar120,local_4e0);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0xd8c);
      auVar110 = vmulps_avx512vl(local_600,auVar107);
      auVar111 = vmulps_avx512vl(local_620,auVar107);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar116,local_720);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar116,local_5e0);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar106,local_520);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar106,local_700);
      auVar24 = vfmadd231ps_fma(auVar110,auVar105,local_500);
      auVar25 = vfmadd231ps_fma(auVar111,auVar105,local_4e0);
      auVar111 = vsubps_avx512vl(ZEXT1632(auVar24),auVar108);
      auVar112 = vsubps_avx512vl(ZEXT1632(auVar25),auVar109);
      auVar110 = vmulps_avx512vl(auVar109,auVar111);
      auVar113 = vmulps_avx512vl(auVar108,auVar112);
      auVar110 = vsubps_avx512vl(auVar110,auVar113);
      auVar100 = vshufps_avx(auVar20,auVar20,0xff);
      uVar154 = auVar100._0_8_;
      local_80._8_8_ = uVar154;
      local_80._0_8_ = uVar154;
      local_80._16_8_ = uVar154;
      local_80._24_8_ = uVar154;
      auVar100 = vshufps_avx(local_6b0,local_6b0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar100);
      auVar100 = vshufps_avx512vl(local_6c0,local_6c0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar100);
      auVar100 = vshufps_avx512vl(_local_6d0,_local_6d0,0xff);
      uVar154 = auVar100._0_8_;
      register0x00001248 = uVar154;
      local_e0 = uVar154;
      register0x00001250 = uVar154;
      register0x00001258 = uVar154;
      auVar113 = vmulps_avx512vl(_local_e0,auVar117);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,local_c0);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar122,local_a0);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar120,local_80);
      auVar114 = vmulps_avx512vl(_local_e0,auVar107);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar116,local_c0);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar106,local_a0);
      auVar26 = vfmadd231ps_fma(auVar114,auVar105,local_80);
      auVar114 = vmulps_avx512vl(auVar112,auVar112);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar111);
      auVar115 = vmaxps_avx512vl(auVar113,ZEXT1632(auVar26));
      auVar115 = vmulps_avx512vl(auVar115,auVar115);
      auVar114 = vmulps_avx512vl(auVar115,auVar114);
      auVar110 = vmulps_avx512vl(auVar110,auVar110);
      uVar154 = vcmpps_avx512vl(auVar110,auVar114,2);
      auVar100 = vblendps_avx(auVar21,auVar20,8);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar99 = vandps_avx512vl(auVar100,auVar102);
      auVar100 = vblendps_avx(auVar22,local_6b0,8);
      auVar100 = vandps_avx512vl(auVar100,auVar102);
      auVar99 = vmaxps_avx(auVar99,auVar100);
      auVar100 = vblendps_avx(auVar101,local_6c0,8);
      auVar103 = vandps_avx512vl(auVar100,auVar102);
      auVar100 = vblendps_avx(auVar23,_local_6d0,8);
      auVar100 = vandps_avx512vl(auVar100,auVar102);
      auVar100 = vmaxps_avx(auVar103,auVar100);
      auVar100 = vmaxps_avx(auVar99,auVar100);
      auVar99 = vmovshdup_avx(auVar100);
      auVar99 = vmaxss_avx(auVar99,auVar100);
      auVar100 = vshufpd_avx(auVar100,auVar100,1);
      auVar100 = vmaxss_avx(auVar100,auVar99);
      _local_480 = vcvtsi2ss_avx512f(local_6c0,iVar8);
      auVar114._0_4_ = local_480._0_4_;
      auVar114._4_4_ = auVar114._0_4_;
      auVar114._8_4_ = auVar114._0_4_;
      auVar114._12_4_ = auVar114._0_4_;
      auVar114._16_4_ = auVar114._0_4_;
      auVar114._20_4_ = auVar114._0_4_;
      auVar114._24_4_ = auVar114._0_4_;
      auVar114._28_4_ = auVar114._0_4_;
      uVar27 = vcmpps_avx512vl(auVar114,_DAT_02020f40,0xe);
      bVar93 = (byte)uVar154 & (byte)uVar27;
      fVar202 = auVar100._0_4_ * 4.7683716e-07;
      auVar110._8_4_ = 2;
      auVar110._0_8_ = 0x200000002;
      auVar110._12_4_ = 2;
      auVar110._16_4_ = 2;
      auVar110._20_4_ = 2;
      auVar110._24_4_ = 2;
      auVar110._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar110,ZEXT1632(auVar21));
      local_120 = vpermps_avx512vl(auVar110,ZEXT1632(auVar22));
      local_140 = vpermps_avx512vl(auVar110,ZEXT1632(auVar101));
      auVar110 = vpermps_avx2(auVar110,ZEXT1632(auVar23));
      fVar192 = *(float *)(ray + k * 4 + 0x60);
      auVar100 = auVar112._0_16_;
      _local_6e0 = ZEXT416((uint)fVar202);
      local_770 = auVar20._0_8_;
      uStack_768 = auVar20._8_8_;
      if (bVar93 == 0) {
        auVar100 = vxorps_avx512vl(auVar100,auVar100);
        auVar239 = ZEXT1664(auVar100);
        auVar236 = ZEXT3264(local_500);
        auVar237 = ZEXT3264(local_4e0);
        auVar238 = ZEXT3264(local_520);
        auVar234 = ZEXT3264(local_700);
        auVar243 = ZEXT3264(local_720);
        auVar240 = ZEXT3264(local_5e0);
      }
      else {
        fStack_55c = 0.0;
        fStack_558 = 0.0;
        fStack_554 = 0.0;
        auVar107 = vmulps_avx512vl(auVar110,auVar107);
        auVar116 = vfmadd213ps_avx512vl(auVar116,local_140,auVar107);
        auVar106 = vfmadd213ps_avx512vl(auVar106,local_120,auVar116);
        auVar115 = vfmadd213ps_avx512vl(auVar105,local_100,auVar106);
        auVar117 = vmulps_avx512vl(auVar110,auVar117);
        auVar118 = vfmadd213ps_avx512vl(auVar118,local_140,auVar117);
        auVar106 = vfmadd213ps_avx512vl(auVar122,local_120,auVar118);
        auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1210);
        auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1694);
        auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1b18);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar30 + 0x1f9c);
        auVar119 = vfmadd213ps_avx512vl(auVar120,local_100,auVar106);
        auVar120 = vmulps_avx512vl(local_600,auVar105);
        auVar106 = vmulps_avx512vl(local_620,auVar105);
        auVar228._0_4_ = auVar110._0_4_ * auVar105._0_4_;
        auVar228._4_4_ = auVar110._4_4_ * auVar105._4_4_;
        auVar228._8_4_ = auVar110._8_4_ * auVar105._8_4_;
        auVar228._12_4_ = auVar110._12_4_ * auVar105._12_4_;
        auVar228._16_4_ = auVar110._16_4_ * auVar105._16_4_;
        auVar228._20_4_ = auVar110._20_4_ * auVar105._20_4_;
        auVar228._24_4_ = auVar110._24_4_ * auVar105._24_4_;
        auVar228._28_4_ = 0;
        auVar243 = ZEXT3264(local_720);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar117,local_720);
        auVar105 = vfmadd231ps_avx512vl(auVar106,auVar117,local_5e0);
        auVar117 = vfmadd231ps_avx512vl(auVar228,local_140,auVar117);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar118,local_520);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar118,local_700);
        auVar106 = vfmadd231ps_avx512vl(auVar117,local_120,auVar118);
        auVar116 = vfmadd231ps_avx512vl(auVar120,auVar122,local_500);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar122,local_4e0);
        auVar120 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1210);
        auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1b18);
        auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1f9c);
        auVar106 = vfmadd231ps_avx512vl(auVar106,local_100,auVar122);
        auVar107 = vmulps_avx512vl(local_600,auVar117);
        auVar121 = vmulps_avx512vl(local_620,auVar117);
        auVar122._4_4_ = auVar110._4_4_ * auVar117._4_4_;
        auVar122._0_4_ = auVar110._0_4_ * auVar117._0_4_;
        auVar122._8_4_ = auVar110._8_4_ * auVar117._8_4_;
        auVar122._12_4_ = auVar110._12_4_ * auVar117._12_4_;
        auVar122._16_4_ = auVar110._16_4_ * auVar117._16_4_;
        auVar122._20_4_ = auVar110._20_4_ * auVar117._20_4_;
        auVar122._24_4_ = auVar110._24_4_ * auVar117._24_4_;
        auVar122._28_4_ = auVar117._28_4_;
        auVar117 = vfmadd231ps_avx512vl(auVar107,auVar118,local_720);
        auVar107 = vfmadd231ps_avx512vl(auVar121,auVar118,local_5e0);
        auVar118 = vfmadd231ps_avx512vl(auVar122,local_140,auVar118);
        auVar122 = *(undefined1 (*) [32])(bezier_basis1 + lVar30 + 0x1694);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar122,local_520);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar122,local_700);
        auVar122 = vfmadd231ps_avx512vl(auVar118,local_120,auVar122);
        auVar118 = vfmadd231ps_avx512vl(auVar117,auVar120,local_500);
        auVar117 = vfmadd231ps_avx512vl(auVar107,auVar120,local_4e0);
        auVar107 = vfmadd231ps_avx512vl(auVar122,local_100,auVar120);
        auVar232._8_4_ = 0x7fffffff;
        auVar232._0_8_ = 0x7fffffff7fffffff;
        auVar232._12_4_ = 0x7fffffff;
        auVar232._16_4_ = 0x7fffffff;
        auVar232._20_4_ = 0x7fffffff;
        auVar232._24_4_ = 0x7fffffff;
        auVar232._28_4_ = 0x7fffffff;
        auVar120 = vandps_avx(auVar116,auVar232);
        auVar122 = vandps_avx(auVar105,auVar232);
        auVar122 = vmaxps_avx(auVar120,auVar122);
        auVar120 = vandps_avx(auVar106,auVar232);
        auVar120 = vmaxps_avx(auVar122,auVar120);
        auVar106 = vbroadcastss_avx512vl(_local_6e0);
        uVar86 = vcmpps_avx512vl(auVar120,auVar106,1);
        bVar13 = (bool)((byte)uVar86 & 1);
        auVar121._0_4_ = (float)((uint)bVar13 * auVar111._0_4_ | (uint)!bVar13 * auVar116._0_4_);
        bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar116._4_4_);
        bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar116._8_4_);
        bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar116._12_4_);
        bVar13 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar121._16_4_ = (float)((uint)bVar13 * auVar111._16_4_ | (uint)!bVar13 * auVar116._16_4_);
        bVar13 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar121._20_4_ = (float)((uint)bVar13 * auVar111._20_4_ | (uint)!bVar13 * auVar116._20_4_);
        bVar13 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar121._24_4_ = (float)((uint)bVar13 * auVar111._24_4_ | (uint)!bVar13 * auVar116._24_4_);
        bVar13 = SUB81(uVar86 >> 7,0);
        auVar121._28_4_ = (uint)bVar13 * auVar111._28_4_ | (uint)!bVar13 * auVar116._28_4_;
        bVar13 = (bool)((byte)uVar86 & 1);
        auVar123._0_4_ = (float)((uint)bVar13 * auVar112._0_4_ | (uint)!bVar13 * auVar105._0_4_);
        bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar105._4_4_);
        bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar105._8_4_);
        bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar105._12_4_);
        bVar13 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * auVar105._16_4_);
        bVar13 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * auVar105._20_4_);
        bVar13 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * auVar105._24_4_);
        bVar13 = SUB81(uVar86 >> 7,0);
        auVar123._28_4_ = (uint)bVar13 * auVar112._28_4_ | (uint)!bVar13 * auVar105._28_4_;
        auVar120 = vandps_avx(auVar232,auVar118);
        auVar122 = vandps_avx(auVar117,auVar232);
        auVar122 = vmaxps_avx(auVar120,auVar122);
        auVar120 = vandps_avx(auVar107,auVar232);
        auVar120 = vmaxps_avx(auVar122,auVar120);
        uVar86 = vcmpps_avx512vl(auVar120,auVar106,1);
        bVar13 = (bool)((byte)uVar86 & 1);
        auVar124._0_4_ = (float)((uint)bVar13 * auVar111._0_4_ | (uint)!bVar13 * auVar118._0_4_);
        bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar118._4_4_);
        bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar118._8_4_);
        bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar118._12_4_);
        bVar13 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar124._16_4_ = (float)((uint)bVar13 * auVar111._16_4_ | (uint)!bVar13 * auVar118._16_4_);
        bVar13 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar124._20_4_ = (float)((uint)bVar13 * auVar111._20_4_ | (uint)!bVar13 * auVar118._20_4_);
        bVar13 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar124._24_4_ = (float)((uint)bVar13 * auVar111._24_4_ | (uint)!bVar13 * auVar118._24_4_);
        bVar13 = SUB81(uVar86 >> 7,0);
        auVar124._28_4_ = (uint)bVar13 * auVar111._28_4_ | (uint)!bVar13 * auVar118._28_4_;
        bVar13 = (bool)((byte)uVar86 & 1);
        auVar125._0_4_ = (float)((uint)bVar13 * auVar112._0_4_ | (uint)!bVar13 * auVar117._0_4_);
        bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar117._4_4_);
        bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar117._8_4_);
        bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar117._12_4_);
        bVar13 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * auVar117._16_4_);
        bVar13 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * auVar117._20_4_);
        bVar13 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * auVar117._24_4_);
        bVar13 = SUB81(uVar86 >> 7,0);
        auVar125._28_4_ = (uint)bVar13 * auVar112._28_4_ | (uint)!bVar13 * auVar117._28_4_;
        auVar104 = vxorps_avx512vl(auVar100,auVar100);
        auVar239 = ZEXT1664(auVar104);
        auVar120 = vfmadd213ps_avx512vl(auVar121,auVar121,ZEXT1632(auVar104));
        auVar100 = vfmadd231ps_fma(auVar120,auVar123,auVar123);
        auVar122 = vrsqrt14ps_avx512vl(ZEXT1632(auVar100));
        fVar191 = auVar122._0_4_;
        fVar201 = auVar122._4_4_;
        fVar203 = auVar122._8_4_;
        fVar204 = auVar122._12_4_;
        fVar182 = auVar122._16_4_;
        fVar190 = auVar122._20_4_;
        fVar94 = auVar122._24_4_;
        auVar120._4_4_ = fVar201 * fVar201 * fVar201 * auVar100._4_4_ * -0.5;
        auVar120._0_4_ = fVar191 * fVar191 * fVar191 * auVar100._0_4_ * -0.5;
        auVar120._8_4_ = fVar203 * fVar203 * fVar203 * auVar100._8_4_ * -0.5;
        auVar120._12_4_ = fVar204 * fVar204 * fVar204 * auVar100._12_4_ * -0.5;
        auVar120._16_4_ = fVar182 * fVar182 * fVar182 * -0.0;
        auVar120._20_4_ = fVar190 * fVar190 * fVar190 * -0.0;
        auVar120._24_4_ = fVar94 * fVar94 * fVar94 * -0.0;
        auVar120._28_4_ = auVar107._28_4_;
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar105,auVar122);
        auVar118._4_4_ = auVar123._4_4_ * auVar120._4_4_;
        auVar118._0_4_ = auVar123._0_4_ * auVar120._0_4_;
        auVar118._8_4_ = auVar123._8_4_ * auVar120._8_4_;
        auVar118._12_4_ = auVar123._12_4_ * auVar120._12_4_;
        auVar118._16_4_ = auVar123._16_4_ * auVar120._16_4_;
        auVar118._20_4_ = auVar123._20_4_ * auVar120._20_4_;
        auVar118._24_4_ = auVar123._24_4_ * auVar120._24_4_;
        auVar118._28_4_ = 0;
        auVar117._4_4_ = auVar120._4_4_ * -auVar121._4_4_;
        auVar117._0_4_ = auVar120._0_4_ * -auVar121._0_4_;
        auVar117._8_4_ = auVar120._8_4_ * -auVar121._8_4_;
        auVar117._12_4_ = auVar120._12_4_ * -auVar121._12_4_;
        auVar117._16_4_ = auVar120._16_4_ * -auVar121._16_4_;
        auVar117._20_4_ = auVar120._20_4_ * -auVar121._20_4_;
        auVar117._24_4_ = auVar120._24_4_ * -auVar121._24_4_;
        auVar117._28_4_ = auVar123._28_4_;
        auVar120 = vmulps_avx512vl(auVar120,ZEXT1632(auVar104));
        auVar111 = ZEXT1632(auVar104);
        auVar122 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar111);
        auVar100 = vfmadd231ps_fma(auVar122,auVar125,auVar125);
        auVar122 = vrsqrt14ps_avx512vl(ZEXT1632(auVar100));
        fVar191 = auVar122._0_4_;
        fVar201 = auVar122._4_4_;
        fVar203 = auVar122._8_4_;
        fVar204 = auVar122._12_4_;
        fVar182 = auVar122._16_4_;
        fVar190 = auVar122._20_4_;
        fVar94 = auVar122._24_4_;
        auVar106._4_4_ = fVar201 * fVar201 * fVar201 * auVar100._4_4_ * -0.5;
        auVar106._0_4_ = fVar191 * fVar191 * fVar191 * auVar100._0_4_ * -0.5;
        auVar106._8_4_ = fVar203 * fVar203 * fVar203 * auVar100._8_4_ * -0.5;
        auVar106._12_4_ = fVar204 * fVar204 * fVar204 * auVar100._12_4_ * -0.5;
        auVar106._16_4_ = fVar182 * fVar182 * fVar182 * -0.0;
        auVar106._20_4_ = fVar190 * fVar190 * fVar190 * -0.0;
        auVar106._24_4_ = fVar94 * fVar94 * fVar94 * -0.0;
        auVar106._28_4_ = 0;
        auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar122);
        auVar116._4_4_ = auVar125._4_4_ * auVar105._4_4_;
        auVar116._0_4_ = auVar125._0_4_ * auVar105._0_4_;
        auVar116._8_4_ = auVar125._8_4_ * auVar105._8_4_;
        auVar116._12_4_ = auVar125._12_4_ * auVar105._12_4_;
        auVar116._16_4_ = auVar125._16_4_ * auVar105._16_4_;
        auVar116._20_4_ = auVar125._20_4_ * auVar105._20_4_;
        auVar116._24_4_ = auVar125._24_4_ * auVar105._24_4_;
        auVar116._28_4_ = auVar122._28_4_;
        auVar107._4_4_ = -auVar124._4_4_ * auVar105._4_4_;
        auVar107._0_4_ = -auVar124._0_4_ * auVar105._0_4_;
        auVar107._8_4_ = -auVar124._8_4_ * auVar105._8_4_;
        auVar107._12_4_ = -auVar124._12_4_ * auVar105._12_4_;
        auVar107._16_4_ = -auVar124._16_4_ * auVar105._16_4_;
        auVar107._20_4_ = -auVar124._20_4_ * auVar105._20_4_;
        auVar107._24_4_ = -auVar124._24_4_ * auVar105._24_4_;
        auVar107._28_4_ = auVar124._28_4_ ^ 0x80000000;
        auVar122 = vmulps_avx512vl(auVar105,auVar111);
        auVar100 = vfmadd213ps_fma(auVar118,auVar113,auVar108);
        auVar99 = vfmadd213ps_fma(auVar117,auVar113,auVar109);
        auVar105 = vfmadd213ps_avx512vl(auVar120,auVar113,auVar119);
        auVar106 = vfmadd213ps_avx512vl(auVar116,ZEXT1632(auVar26),ZEXT1632(auVar24));
        auVar102 = vfnmadd213ps_fma(auVar118,auVar113,auVar108);
        auVar108 = ZEXT1632(auVar26);
        auVar101 = vfmadd213ps_fma(auVar107,auVar108,ZEXT1632(auVar25));
        auVar103 = vfnmadd213ps_fma(auVar117,auVar113,auVar109);
        auVar21 = vfmadd213ps_fma(auVar122,auVar108,auVar115);
        auVar118 = vfnmadd231ps_avx512vl(auVar119,auVar113,auVar120);
        auVar24 = vfnmadd213ps_fma(auVar116,auVar108,ZEXT1632(auVar24));
        auVar25 = vfnmadd213ps_fma(auVar107,auVar108,ZEXT1632(auVar25));
        auVar32 = vfnmadd231ps_fma(auVar115,ZEXT1632(auVar26),auVar122);
        auVar122 = vsubps_avx512vl(auVar106,ZEXT1632(auVar102));
        auVar120 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar103));
        auVar117 = vsubps_avx512vl(ZEXT1632(auVar21),auVar118);
        auVar116 = vmulps_avx512vl(auVar120,auVar118);
        auVar22 = vfmsub231ps_fma(auVar116,ZEXT1632(auVar103),auVar117);
        auVar108._4_4_ = auVar102._4_4_ * auVar117._4_4_;
        auVar108._0_4_ = auVar102._0_4_ * auVar117._0_4_;
        auVar108._8_4_ = auVar102._8_4_ * auVar117._8_4_;
        auVar108._12_4_ = auVar102._12_4_ * auVar117._12_4_;
        auVar108._16_4_ = auVar117._16_4_ * 0.0;
        auVar108._20_4_ = auVar117._20_4_ * 0.0;
        auVar108._24_4_ = auVar117._24_4_ * 0.0;
        auVar108._28_4_ = auVar117._28_4_;
        auVar117 = vfmsub231ps_avx512vl(auVar108,auVar118,auVar122);
        auVar109._4_4_ = auVar103._4_4_ * auVar122._4_4_;
        auVar109._0_4_ = auVar103._0_4_ * auVar122._0_4_;
        auVar109._8_4_ = auVar103._8_4_ * auVar122._8_4_;
        auVar109._12_4_ = auVar103._12_4_ * auVar122._12_4_;
        auVar109._16_4_ = auVar122._16_4_ * 0.0;
        auVar109._20_4_ = auVar122._20_4_ * 0.0;
        auVar109._24_4_ = auVar122._24_4_ * 0.0;
        auVar109._28_4_ = auVar122._28_4_;
        auVar23 = vfmsub231ps_fma(auVar109,ZEXT1632(auVar102),auVar120);
        auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar111,auVar117);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar111,ZEXT1632(auVar22));
        auVar121 = ZEXT1632(auVar104);
        uVar86 = vcmpps_avx512vl(auVar120,auVar121,2);
        bVar85 = (byte)uVar86;
        fVar94 = (float)((uint)(bVar85 & 1) * auVar100._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar24._0_4_);
        bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
        fVar146 = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar24._4_4_);
        bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
        fVar148 = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar24._8_4_);
        bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
        fVar150 = (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar24._12_4_);
        auVar116 = ZEXT1632(CONCAT412(fVar150,CONCAT48(fVar148,CONCAT44(fVar146,fVar94))));
        fVar95 = (float)((uint)(bVar85 & 1) * auVar99._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar25._0_4_);
        bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
        fVar147 = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar25._4_4_);
        bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
        fVar149 = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar25._8_4_);
        bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
        fVar151 = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar25._12_4_);
        auVar107 = ZEXT1632(CONCAT412(fVar151,CONCAT48(fVar149,CONCAT44(fVar147,fVar95))));
        auVar119._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar32._0_4_
                    );
        bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar13 * auVar105._4_4_ | (uint)!bVar13 * auVar32._4_4_);
        bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar13 * auVar105._8_4_ | (uint)!bVar13 * auVar32._8_4_);
        bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar13 * auVar105._12_4_ | (uint)!bVar13 * auVar32._12_4_);
        fVar201 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar105._16_4_);
        auVar119._16_4_ = fVar201;
        fVar191 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar105._20_4_);
        auVar119._20_4_ = fVar191;
        fVar203 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar105._24_4_);
        auVar119._24_4_ = fVar203;
        iVar1 = (uint)(byte)(uVar86 >> 7) * auVar105._28_4_;
        auVar119._28_4_ = iVar1;
        auVar122 = vblendmps_avx512vl(ZEXT1632(auVar102),auVar106);
        auVar126._0_4_ =
             (uint)(bVar85 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar22._0_4_;
        bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar22._4_4_;
        bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar22._8_4_;
        bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar22._12_4_;
        auVar126._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar122._16_4_;
        auVar126._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar122._20_4_;
        auVar126._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar122._24_4_;
        auVar126._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar122._28_4_;
        auVar122 = vblendmps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar101));
        auVar127._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar99._0_4_
                    );
        bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar99._4_4_);
        bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar99._8_4_);
        bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar99._12_4_);
        fVar204 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar122._16_4_);
        auVar127._16_4_ = fVar204;
        fVar182 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar122._20_4_);
        auVar127._20_4_ = fVar182;
        fVar190 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar122._24_4_);
        auVar127._24_4_ = fVar190;
        auVar127._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar122._28_4_;
        auVar122 = vblendmps_avx512vl(auVar118,ZEXT1632(auVar21));
        auVar128._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar122._0_4_ |
                    (uint)!(bool)(bVar85 & 1) * auVar105._0_4_);
        bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar105._4_4_);
        bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar105._8_4_);
        bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar105._12_4_);
        bVar13 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar128._16_4_ = (float)((uint)bVar13 * auVar122._16_4_ | (uint)!bVar13 * auVar105._16_4_);
        bVar13 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar128._20_4_ = (float)((uint)bVar13 * auVar122._20_4_ | (uint)!bVar13 * auVar105._20_4_);
        bVar13 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar128._24_4_ = (float)((uint)bVar13 * auVar122._24_4_ | (uint)!bVar13 * auVar105._24_4_);
        bVar13 = SUB81(uVar86 >> 7,0);
        auVar128._28_4_ = (uint)bVar13 * auVar122._28_4_ | (uint)!bVar13 * auVar105._28_4_;
        auVar129._0_4_ =
             (uint)(bVar85 & 1) * (int)auVar102._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar106._0_4_;
        bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar13 * (int)auVar102._4_4_ | (uint)!bVar13 * auVar106._4_4_;
        bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar13 * (int)auVar102._8_4_ | (uint)!bVar13 * auVar106._8_4_;
        bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar13 * (int)auVar102._12_4_ | (uint)!bVar13 * auVar106._12_4_;
        auVar129._16_4_ = (uint)!(bool)((byte)(uVar86 >> 4) & 1) * auVar106._16_4_;
        auVar129._20_4_ = (uint)!(bool)((byte)(uVar86 >> 5) & 1) * auVar106._20_4_;
        auVar129._24_4_ = (uint)!(bool)((byte)(uVar86 >> 6) & 1) * auVar106._24_4_;
        auVar129._28_4_ = (uint)!SUB81(uVar86 >> 7,0) * auVar106._28_4_;
        bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar86 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar130._0_4_ =
             (uint)(bVar85 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar21._0_4_;
        bVar14 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar14 * auVar118._4_4_ | (uint)!bVar14 * auVar21._4_4_;
        bVar14 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar14 * auVar118._8_4_ | (uint)!bVar14 * auVar21._8_4_;
        bVar14 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar14 * auVar118._12_4_ | (uint)!bVar14 * auVar21._12_4_;
        auVar130._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar118._16_4_;
        auVar130._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar118._20_4_;
        auVar130._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar118._24_4_;
        iVar2 = (uint)(byte)(uVar86 >> 7) * auVar118._28_4_;
        auVar130._28_4_ = iVar2;
        auVar108 = vsubps_avx512vl(auVar129,auVar116);
        auVar122 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar103._12_4_ |
                                                 (uint)!bVar16 * auVar101._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar103._8_4_ |
                                                          (uint)!bVar15 * auVar101._8_4_,
                                                          CONCAT44((uint)bVar13 *
                                                                   (int)auVar103._4_4_ |
                                                                   (uint)!bVar13 * auVar101._4_4_,
                                                                   (uint)(bVar85 & 1) *
                                                                   (int)auVar103._0_4_ |
                                                                   (uint)!(bool)(bVar85 & 1) *
                                                                   auVar101._0_4_)))),auVar107);
        auVar118 = vsubps_avx(auVar130,auVar119);
        auVar117 = vsubps_avx(auVar116,auVar126);
        auVar105 = vsubps_avx(auVar107,auVar127);
        auVar106 = vsubps_avx(auVar119,auVar128);
        auVar111._4_4_ = auVar118._4_4_ * fVar146;
        auVar111._0_4_ = auVar118._0_4_ * fVar94;
        auVar111._8_4_ = auVar118._8_4_ * fVar148;
        auVar111._12_4_ = auVar118._12_4_ * fVar150;
        auVar111._16_4_ = auVar118._16_4_ * 0.0;
        auVar111._20_4_ = auVar118._20_4_ * 0.0;
        auVar111._24_4_ = auVar118._24_4_ * 0.0;
        auVar111._28_4_ = iVar2;
        auVar100 = vfmsub231ps_fma(auVar111,auVar119,auVar108);
        auVar112._4_4_ = fVar147 * auVar108._4_4_;
        auVar112._0_4_ = fVar95 * auVar108._0_4_;
        auVar112._8_4_ = fVar149 * auVar108._8_4_;
        auVar112._12_4_ = fVar151 * auVar108._12_4_;
        auVar112._16_4_ = auVar108._16_4_ * 0.0;
        auVar112._20_4_ = auVar108._20_4_ * 0.0;
        auVar112._24_4_ = auVar108._24_4_ * 0.0;
        auVar112._28_4_ = auVar120._28_4_;
        auVar99 = vfmsub231ps_fma(auVar112,auVar116,auVar122);
        auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar121,ZEXT1632(auVar100));
        auVar195._0_4_ = auVar122._0_4_ * auVar119._0_4_;
        auVar195._4_4_ = auVar122._4_4_ * auVar119._4_4_;
        auVar195._8_4_ = auVar122._8_4_ * auVar119._8_4_;
        auVar195._12_4_ = auVar122._12_4_ * auVar119._12_4_;
        auVar195._16_4_ = auVar122._16_4_ * fVar201;
        auVar195._20_4_ = auVar122._20_4_ * fVar191;
        auVar195._24_4_ = auVar122._24_4_ * fVar203;
        auVar195._28_4_ = 0;
        auVar100 = vfmsub231ps_fma(auVar195,auVar107,auVar118);
        auVar109 = vfmadd231ps_avx512vl(auVar120,auVar121,ZEXT1632(auVar100));
        auVar120 = vmulps_avx512vl(auVar106,auVar126);
        auVar120 = vfmsub231ps_avx512vl(auVar120,auVar117,auVar128);
        auVar115._4_4_ = auVar105._4_4_ * auVar128._4_4_;
        auVar115._0_4_ = auVar105._0_4_ * auVar128._0_4_;
        auVar115._8_4_ = auVar105._8_4_ * auVar128._8_4_;
        auVar115._12_4_ = auVar105._12_4_ * auVar128._12_4_;
        auVar115._16_4_ = auVar105._16_4_ * auVar128._16_4_;
        auVar115._20_4_ = auVar105._20_4_ * auVar128._20_4_;
        auVar115._24_4_ = auVar105._24_4_ * auVar128._24_4_;
        auVar115._28_4_ = auVar128._28_4_;
        auVar100 = vfmsub231ps_fma(auVar115,auVar127,auVar106);
        auVar196._0_4_ = auVar127._0_4_ * auVar117._0_4_;
        auVar196._4_4_ = auVar127._4_4_ * auVar117._4_4_;
        auVar196._8_4_ = auVar127._8_4_ * auVar117._8_4_;
        auVar196._12_4_ = auVar127._12_4_ * auVar117._12_4_;
        auVar196._16_4_ = fVar204 * auVar117._16_4_;
        auVar196._20_4_ = fVar182 * auVar117._20_4_;
        auVar196._24_4_ = fVar190 * auVar117._24_4_;
        auVar196._28_4_ = 0;
        auVar99 = vfmsub231ps_fma(auVar196,auVar105,auVar126);
        auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar121,auVar120);
        auVar111 = vfmadd231ps_avx512vl(auVar120,auVar121,ZEXT1632(auVar100));
        auVar120 = vmaxps_avx(auVar109,auVar111);
        uVar154 = vcmpps_avx512vl(auVar120,auVar121,2);
        bVar93 = bVar93 & (byte)uVar154;
        auVar236 = ZEXT3264(local_500);
        auVar237 = ZEXT3264(local_4e0);
        auVar238 = ZEXT3264(local_520);
        auVar234 = ZEXT3264(local_700);
        auVar230 = ZEXT1664(_local_6e0);
        if (bVar93 == 0) {
          bVar93 = 0;
        }
        else {
          auVar44._4_4_ = auVar106._4_4_ * auVar122._4_4_;
          auVar44._0_4_ = auVar106._0_4_ * auVar122._0_4_;
          auVar44._8_4_ = auVar106._8_4_ * auVar122._8_4_;
          auVar44._12_4_ = auVar106._12_4_ * auVar122._12_4_;
          auVar44._16_4_ = auVar106._16_4_ * auVar122._16_4_;
          auVar44._20_4_ = auVar106._20_4_ * auVar122._20_4_;
          auVar44._24_4_ = auVar106._24_4_ * auVar122._24_4_;
          auVar44._28_4_ = auVar120._28_4_;
          auVar101 = vfmsub231ps_fma(auVar44,auVar105,auVar118);
          auVar45._4_4_ = auVar118._4_4_ * auVar117._4_4_;
          auVar45._0_4_ = auVar118._0_4_ * auVar117._0_4_;
          auVar45._8_4_ = auVar118._8_4_ * auVar117._8_4_;
          auVar45._12_4_ = auVar118._12_4_ * auVar117._12_4_;
          auVar45._16_4_ = auVar118._16_4_ * auVar117._16_4_;
          auVar45._20_4_ = auVar118._20_4_ * auVar117._20_4_;
          auVar45._24_4_ = auVar118._24_4_ * auVar117._24_4_;
          auVar45._28_4_ = auVar118._28_4_;
          auVar99 = vfmsub231ps_fma(auVar45,auVar108,auVar106);
          auVar46._4_4_ = auVar105._4_4_ * auVar108._4_4_;
          auVar46._0_4_ = auVar105._0_4_ * auVar108._0_4_;
          auVar46._8_4_ = auVar105._8_4_ * auVar108._8_4_;
          auVar46._12_4_ = auVar105._12_4_ * auVar108._12_4_;
          auVar46._16_4_ = auVar105._16_4_ * auVar108._16_4_;
          auVar46._20_4_ = auVar105._20_4_ * auVar108._20_4_;
          auVar46._24_4_ = auVar105._24_4_ * auVar108._24_4_;
          auVar46._28_4_ = auVar105._28_4_;
          auVar21 = vfmsub231ps_fma(auVar46,auVar117,auVar122);
          auVar100 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar99),ZEXT1632(auVar21));
          auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),ZEXT1632(auVar101),auVar121);
          auVar122 = vrcp14ps_avx512vl(auVar120);
          auVar35._8_4_ = 0x3f800000;
          auVar35._0_8_ = &DAT_3f8000003f800000;
          auVar35._12_4_ = 0x3f800000;
          auVar35._16_4_ = 0x3f800000;
          auVar35._20_4_ = 0x3f800000;
          auVar35._24_4_ = 0x3f800000;
          auVar35._28_4_ = 0x3f800000;
          auVar118 = vfnmadd213ps_avx512vl(auVar122,auVar120,auVar35);
          auVar100 = vfmadd132ps_fma(auVar118,auVar122,auVar122);
          auVar47._4_4_ = auVar21._4_4_ * auVar119._4_4_;
          auVar47._0_4_ = auVar21._0_4_ * auVar119._0_4_;
          auVar47._8_4_ = auVar21._8_4_ * auVar119._8_4_;
          auVar47._12_4_ = auVar21._12_4_ * auVar119._12_4_;
          auVar47._16_4_ = fVar201 * 0.0;
          auVar47._20_4_ = fVar191 * 0.0;
          auVar47._24_4_ = fVar203 * 0.0;
          auVar47._28_4_ = iVar1;
          auVar99 = vfmadd231ps_fma(auVar47,auVar107,ZEXT1632(auVar99));
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar116,ZEXT1632(auVar101));
          fVar191 = auVar100._0_4_;
          fVar201 = auVar100._4_4_;
          fVar203 = auVar100._8_4_;
          fVar204 = auVar100._12_4_;
          auVar122 = ZEXT1632(CONCAT412(auVar99._12_4_ * fVar204,
                                        CONCAT48(auVar99._8_4_ * fVar203,
                                                 CONCAT44(auVar99._4_4_ * fVar201,
                                                          auVar99._0_4_ * fVar191))));
          auVar220._4_4_ = fVar192;
          auVar220._0_4_ = fVar192;
          auVar220._8_4_ = fVar192;
          auVar220._12_4_ = fVar192;
          auVar220._16_4_ = fVar192;
          auVar220._20_4_ = fVar192;
          auVar220._24_4_ = fVar192;
          auVar220._28_4_ = fVar192;
          uVar154 = vcmpps_avx512vl(auVar220,auVar122,2);
          uVar153 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar36._4_4_ = uVar153;
          auVar36._0_4_ = uVar153;
          auVar36._8_4_ = uVar153;
          auVar36._12_4_ = uVar153;
          auVar36._16_4_ = uVar153;
          auVar36._20_4_ = uVar153;
          auVar36._24_4_ = uVar153;
          auVar36._28_4_ = uVar153;
          uVar27 = vcmpps_avx512vl(auVar122,auVar36,2);
          bVar93 = (byte)uVar154 & (byte)uVar27 & bVar93;
          if (bVar93 != 0) {
            uVar154 = vcmpps_avx512vl(auVar120,auVar121,4);
            if ((bVar93 & (byte)uVar154) != 0) {
              bVar93 = bVar93 & (byte)uVar154;
              fVar182 = auVar109._0_4_ * fVar191;
              fVar190 = auVar109._4_4_ * fVar201;
              auVar48._4_4_ = fVar190;
              auVar48._0_4_ = fVar182;
              fVar94 = auVar109._8_4_ * fVar203;
              auVar48._8_4_ = fVar94;
              fVar95 = auVar109._12_4_ * fVar204;
              auVar48._12_4_ = fVar95;
              fVar146 = auVar109._16_4_ * 0.0;
              auVar48._16_4_ = fVar146;
              fVar147 = auVar109._20_4_ * 0.0;
              auVar48._20_4_ = fVar147;
              fVar148 = auVar109._24_4_ * 0.0;
              auVar48._24_4_ = fVar148;
              auVar48._28_4_ = auVar109._28_4_;
              fVar191 = auVar111._0_4_ * fVar191;
              fVar201 = auVar111._4_4_ * fVar201;
              auVar49._4_4_ = fVar201;
              auVar49._0_4_ = fVar191;
              fVar203 = auVar111._8_4_ * fVar203;
              auVar49._8_4_ = fVar203;
              fVar204 = auVar111._12_4_ * fVar204;
              auVar49._12_4_ = fVar204;
              fVar149 = auVar111._16_4_ * 0.0;
              auVar49._16_4_ = fVar149;
              fVar150 = auVar111._20_4_ * 0.0;
              auVar49._20_4_ = fVar150;
              fVar151 = auVar111._24_4_ * 0.0;
              auVar49._24_4_ = fVar151;
              auVar49._28_4_ = auVar111._28_4_;
              auVar212._8_4_ = 0x3f800000;
              auVar212._0_8_ = &DAT_3f8000003f800000;
              auVar212._12_4_ = 0x3f800000;
              auVar212._16_4_ = 0x3f800000;
              auVar212._20_4_ = 0x3f800000;
              auVar212._24_4_ = 0x3f800000;
              auVar212._28_4_ = 0x3f800000;
              auVar120 = vsubps_avx(auVar212,auVar48);
              local_640._0_4_ =
                   (uint)(bVar85 & 1) * (int)fVar182 | (uint)!(bool)(bVar85 & 1) * auVar120._0_4_;
              bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
              local_640._4_4_ = (uint)bVar13 * (int)fVar190 | (uint)!bVar13 * auVar120._4_4_;
              bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
              local_640._8_4_ = (uint)bVar13 * (int)fVar94 | (uint)!bVar13 * auVar120._8_4_;
              bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
              local_640._12_4_ = (uint)bVar13 * (int)fVar95 | (uint)!bVar13 * auVar120._12_4_;
              bVar13 = (bool)((byte)(uVar86 >> 4) & 1);
              local_640._16_4_ = (uint)bVar13 * (int)fVar146 | (uint)!bVar13 * auVar120._16_4_;
              bVar13 = (bool)((byte)(uVar86 >> 5) & 1);
              local_640._20_4_ = (uint)bVar13 * (int)fVar147 | (uint)!bVar13 * auVar120._20_4_;
              bVar13 = (bool)((byte)(uVar86 >> 6) & 1);
              local_640._24_4_ = (uint)bVar13 * (int)fVar148 | (uint)!bVar13 * auVar120._24_4_;
              bVar13 = SUB81(uVar86 >> 7,0);
              local_640._28_4_ = (uint)bVar13 * auVar109._28_4_ | (uint)!bVar13 * auVar120._28_4_;
              auVar120 = vsubps_avx(auVar212,auVar49);
              bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar86 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar86 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar86 >> 6) & 1);
              bVar19 = SUB81(uVar86 >> 7,0);
              local_2e0._4_4_ = (uint)bVar13 * (int)fVar201 | (uint)!bVar13 * auVar120._4_4_;
              local_2e0._0_4_ =
                   (uint)(bVar85 & 1) * (int)fVar191 | (uint)!(bool)(bVar85 & 1) * auVar120._0_4_;
              local_2e0._8_4_ = (uint)bVar14 * (int)fVar203 | (uint)!bVar14 * auVar120._8_4_;
              local_2e0._12_4_ = (uint)bVar15 * (int)fVar204 | (uint)!bVar15 * auVar120._12_4_;
              local_2e0._16_4_ = (uint)bVar16 * (int)fVar149 | (uint)!bVar16 * auVar120._16_4_;
              local_2e0._20_4_ = (uint)bVar17 * (int)fVar150 | (uint)!bVar17 * auVar120._20_4_;
              local_2e0._24_4_ = (uint)bVar18 * (int)fVar151 | (uint)!bVar18 * auVar120._24_4_;
              local_2e0._28_4_ = (uint)bVar19 * auVar111._28_4_ | (uint)!bVar19 * auVar120._28_4_;
              local_660 = auVar122;
              goto LAB_01c13602;
            }
          }
          bVar93 = 0;
        }
LAB_01c13602:
        auVar242 = ZEXT3264(local_620);
        auVar241 = ZEXT3264(local_600);
        auVar240 = ZEXT3264(local_5e0);
        auVar235 = ZEXT3264(auVar110);
        if (bVar93 != 0) {
          auVar120 = vsubps_avx(ZEXT1632(auVar26),auVar113);
          auVar100 = vfmadd213ps_fma(auVar120,local_640,auVar113);
          uVar153 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar113._4_4_ = uVar153;
          auVar113._0_4_ = uVar153;
          auVar113._8_4_ = uVar153;
          auVar113._12_4_ = uVar153;
          auVar113._16_4_ = uVar153;
          auVar113._20_4_ = uVar153;
          auVar113._24_4_ = uVar153;
          auVar113._28_4_ = uVar153;
          auVar120 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar100._12_4_ + auVar100._12_4_,
                                                        CONCAT48(auVar100._8_4_ + auVar100._8_4_,
                                                                 CONCAT44(auVar100._4_4_ +
                                                                          auVar100._4_4_,
                                                                          auVar100._0_4_ +
                                                                          auVar100._0_4_)))),
                                     auVar113);
          uVar154 = vcmpps_avx512vl(local_660,auVar120,6);
          bVar93 = bVar93 & (byte)uVar154;
          if (bVar93 != 0) {
            auVar163._8_4_ = 0xbf800000;
            auVar163._0_8_ = 0xbf800000bf800000;
            auVar163._12_4_ = 0xbf800000;
            auVar163._16_4_ = 0xbf800000;
            auVar163._20_4_ = 0xbf800000;
            auVar163._24_4_ = 0xbf800000;
            auVar163._28_4_ = 0xbf800000;
            auVar37._8_4_ = 0x40000000;
            auVar37._0_8_ = 0x4000000040000000;
            auVar37._12_4_ = 0x40000000;
            auVar37._16_4_ = 0x40000000;
            auVar37._20_4_ = 0x40000000;
            auVar37._24_4_ = 0x40000000;
            auVar37._28_4_ = 0x40000000;
            local_440 = vfmadd132ps_avx512vl(local_2e0,auVar163,auVar37);
            local_2e0 = local_440;
            auVar120 = local_2e0;
            local_400 = 0;
            local_3f0 = local_770;
            uStack_3e8 = uStack_768;
            local_3e0 = local_6b0._0_8_;
            uStack_3d8 = local_6b0._8_8_;
            local_3d0 = local_6c0._0_8_;
            uStack_3c8 = local_6c0._8_8_;
            local_3c0 = local_6d0;
            uStack_3b8 = uStack_6c8;
            local_2e0 = auVar120;
            if ((pGVar90->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar191 = 1.0 / auVar114._0_4_;
              local_3a0[0] = fVar191 * (local_640._0_4_ + 0.0);
              local_3a0[1] = fVar191 * (local_640._4_4_ + 1.0);
              local_3a0[2] = fVar191 * (local_640._8_4_ + 2.0);
              local_3a0[3] = fVar191 * (local_640._12_4_ + 3.0);
              fStack_390 = fVar191 * (local_640._16_4_ + 4.0);
              fStack_38c = fVar191 * (local_640._20_4_ + 5.0);
              fStack_388 = fVar191 * (local_640._24_4_ + 6.0);
              fStack_384 = local_640._28_4_ + 7.0;
              local_2e0._0_8_ = local_440._0_8_;
              local_2e0._8_8_ = local_440._8_8_;
              local_2e0._16_8_ = local_440._16_8_;
              local_2e0._24_8_ = local_440._24_8_;
              local_380 = local_2e0._0_8_;
              uStack_378 = local_2e0._8_8_;
              uStack_370 = local_2e0._16_8_;
              uStack_368 = local_2e0._24_8_;
              local_360 = local_660;
              auVar164._8_4_ = 0x7f800000;
              auVar164._0_8_ = 0x7f8000007f800000;
              auVar164._12_4_ = 0x7f800000;
              auVar164._16_4_ = 0x7f800000;
              auVar164._20_4_ = 0x7f800000;
              auVar164._24_4_ = 0x7f800000;
              auVar164._28_4_ = 0x7f800000;
              auVar120 = vblendmps_avx512vl(auVar164,local_660);
              auVar131._0_4_ =
                   (uint)(bVar93 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar93 & 1) * 0x7f800000;
              bVar13 = (bool)(bVar93 >> 1 & 1);
              auVar131._4_4_ = (uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar93 >> 2 & 1);
              auVar131._8_4_ = (uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar93 >> 3 & 1);
              auVar131._12_4_ = (uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar93 >> 4 & 1);
              auVar131._16_4_ = (uint)bVar13 * auVar120._16_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar93 >> 5 & 1);
              auVar131._20_4_ = (uint)bVar13 * auVar120._20_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar93 >> 6 & 1);
              auVar131._24_4_ = (uint)bVar13 * auVar120._24_4_ | (uint)!bVar13 * 0x7f800000;
              auVar131._28_4_ =
                   (uint)(bVar93 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
              auVar120 = vshufps_avx(auVar131,auVar131,0xb1);
              auVar120 = vminps_avx(auVar131,auVar120);
              auVar122 = vshufpd_avx(auVar120,auVar120,5);
              auVar120 = vminps_avx(auVar120,auVar122);
              auVar122 = vpermpd_avx2(auVar120,0x4e);
              auVar120 = vminps_avx(auVar120,auVar122);
              uVar154 = vcmpps_avx512vl(auVar131,auVar120,0);
              bVar84 = (byte)uVar154 & bVar93;
              bVar85 = bVar93;
              if (bVar84 != 0) {
                bVar85 = bVar84;
              }
              uVar29 = 0;
              for (uVar87 = (uint)bVar85; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                uVar29 = uVar29 + 1;
              }
              uVar86 = (ulong)uVar29;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar90->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar191 = local_3a0[uVar86];
                uVar153 = *(undefined4 *)((long)&local_380 + uVar86 * 4);
                fVar203 = 1.0 - fVar191;
                fVar201 = fVar203 * fVar203 * -3.0;
                auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * fVar203)),
                                           ZEXT416((uint)(fVar191 * fVar203)),ZEXT416(0xc0000000));
                auVar99 = vfmsub132ss_fma(ZEXT416((uint)(fVar191 * fVar203)),
                                          ZEXT416((uint)(fVar191 * fVar191)),ZEXT416(0x40000000));
                fVar203 = auVar100._0_4_ * 3.0;
                fVar204 = auVar99._0_4_ * 3.0;
                fVar182 = fVar191 * fVar191 * 3.0;
                auVar208._0_4_ = fVar182 * (float)local_6d0._0_4_;
                auVar208._4_4_ = fVar182 * (float)local_6d0._4_4_;
                auVar208._8_4_ = fVar182 * (float)uStack_6c8;
                auVar208._12_4_ = fVar182 * uStack_6c8._4_4_;
                auVar178._4_4_ = fVar204;
                auVar178._0_4_ = fVar204;
                auVar178._8_4_ = fVar204;
                auVar178._12_4_ = fVar204;
                auVar100 = vfmadd132ps_fma(auVar178,auVar208,local_6c0);
                auVar185._4_4_ = fVar203;
                auVar185._0_4_ = fVar203;
                auVar185._8_4_ = fVar203;
                auVar185._12_4_ = fVar203;
                auVar100 = vfmadd132ps_fma(auVar185,auVar100,local_6b0);
                auVar179._4_4_ = fVar201;
                auVar179._0_4_ = fVar201;
                auVar179._8_4_ = fVar201;
                auVar179._12_4_ = fVar201;
                auVar100 = vfmadd132ps_fma(auVar179,auVar100,auVar20);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + uVar86 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar100._0_4_;
                uVar9 = vextractps_avx(auVar100,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                uVar9 = vextractps_avx(auVar100,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                *(float *)(ray + k * 4 + 0x1e0) = fVar191;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar153;
                *(uint *)(ray + k * 4 + 0x220) = uVar7;
                *(uint *)(ray + k * 4 + 0x240) = uVar91;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_340 = vpbroadcastd_avx512vl();
                local_4c0 = vpbroadcastd_avx512vl();
                local_580 = local_6b0._0_4_;
                uStack_57c = local_6b0._4_4_;
                uStack_578 = local_6b0._8_8_;
                local_590 = local_6c0._0_8_;
                uStack_588 = local_6c0._8_8_;
                local_5a0 = (float)local_6d0._0_4_;
                fStack_59c = (float)local_6d0._4_4_;
                fStack_598 = (float)uStack_6c8;
                fStack_594 = uStack_6c8._4_4_;
                local_560 = fVar192;
                local_540 = auVar110;
                local_460 = local_640;
                local_420 = local_660;
                local_3fc = iVar8;
                local_3b0 = bVar93;
                do {
                  auVar101 = auVar239._0_16_;
                  local_320._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_200 = local_3a0[uVar86];
                  local_1e0 = *(undefined4 *)((long)&local_380 + uVar86 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + uVar86 * 4);
                  local_760.context = context->user;
                  fVar191 = 1.0 - local_200;
                  fVar202 = fVar191 * fVar191 * -3.0;
                  auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar191 * fVar191)),
                                             ZEXT416((uint)(local_200 * fVar191)),
                                             ZEXT416(0xc0000000));
                  auVar99 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar191)),
                                            ZEXT416((uint)(local_200 * local_200)),
                                            ZEXT416(0x40000000));
                  fVar191 = auVar100._0_4_ * 3.0;
                  fVar201 = auVar99._0_4_ * 3.0;
                  fVar203 = local_200 * local_200 * 3.0;
                  auVar211._0_4_ = fVar203 * local_5a0;
                  auVar211._4_4_ = fVar203 * fStack_59c;
                  auVar211._8_4_ = fVar203 * fStack_598;
                  auVar211._12_4_ = fVar203 * fStack_594;
                  auVar161._4_4_ = fVar201;
                  auVar161._0_4_ = fVar201;
                  auVar161._8_4_ = fVar201;
                  auVar161._12_4_ = fVar201;
                  auVar80._8_8_ = uStack_588;
                  auVar80._0_8_ = local_590;
                  auVar100 = vfmadd132ps_fma(auVar161,auVar211,auVar80);
                  auVar188._4_4_ = fVar191;
                  auVar188._0_4_ = fVar191;
                  auVar188._8_4_ = fVar191;
                  auVar188._12_4_ = fVar191;
                  auVar81._4_4_ = uStack_57c;
                  auVar81._0_4_ = local_580;
                  auVar81._8_8_ = uStack_578;
                  auVar100 = vfmadd132ps_fma(auVar188,auVar100,auVar81);
                  auVar162._4_4_ = fVar202;
                  auVar162._0_4_ = fVar202;
                  auVar162._8_4_ = fVar202;
                  auVar162._12_4_ = fVar202;
                  auVar100 = vfmadd132ps_fma(auVar162,auVar100,auVar20);
                  local_260 = auVar100._0_4_;
                  auVar200._8_4_ = 1;
                  auVar200._0_8_ = 0x100000001;
                  auVar200._12_4_ = 1;
                  auVar200._16_4_ = 1;
                  auVar200._20_4_ = 1;
                  auVar200._24_4_ = 1;
                  auVar200._28_4_ = 1;
                  local_240 = vpermps_avx2(auVar200,ZEXT1632(auVar100));
                  auVar215._8_4_ = 2;
                  auVar215._0_8_ = 0x200000002;
                  auVar215._12_4_ = 2;
                  auVar215._16_4_ = 2;
                  auVar215._20_4_ = 2;
                  auVar215._24_4_ = 2;
                  auVar215._28_4_ = 2;
                  local_220 = vpermps_avx2(auVar215,ZEXT1632(auVar100));
                  iStack_25c = local_260;
                  iStack_258 = local_260;
                  iStack_254 = local_260;
                  iStack_250 = local_260;
                  iStack_24c = local_260;
                  iStack_248 = local_260;
                  iStack_244 = local_260;
                  fStack_1fc = local_200;
                  fStack_1f8 = local_200;
                  fStack_1f4 = local_200;
                  fStack_1f0 = local_200;
                  fStack_1ec = local_200;
                  fStack_1e8 = local_200;
                  fStack_1e4 = local_200;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = local_4c0._0_8_;
                  uStack_1b8 = local_4c0._8_8_;
                  uStack_1b0 = local_4c0._16_8_;
                  uStack_1a8 = local_4c0._24_8_;
                  local_1a0 = local_340;
                  auVar120 = vpcmpeqd_avx2(local_340,local_340);
                  local_728[1] = auVar120;
                  *local_728 = auVar120;
                  local_180 = (local_760.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_760.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_5c0 = local_280._0_8_;
                  uStack_5b8 = local_280._8_8_;
                  uStack_5b0 = local_280._16_8_;
                  uStack_5a8 = local_280._24_8_;
                  local_760.valid = (int *)&local_5c0;
                  local_760.geometryUserPtr = pGVar90->userPtr;
                  local_760.hit = (RTCHitN *)&local_260;
                  local_760.N = 8;
                  local_4a0 = (undefined4)uVar86;
                  uStack_49c = (undefined4)(uVar86 >> 0x20);
                  local_760.ray = (RTCRayN *)ray;
                  if (pGVar90->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar90->intersectionFilterN)(&local_760);
                    uVar86 = CONCAT44(uStack_49c,local_4a0);
                    auVar230 = ZEXT1664(_local_6e0);
                    auVar235 = ZEXT3264(local_540);
                    auVar242 = ZEXT3264(local_620);
                    auVar241 = ZEXT3264(local_600);
                    auVar240 = ZEXT3264(local_5e0);
                    auVar243 = ZEXT3264(local_720);
                    auVar234 = ZEXT3264(local_700);
                    auVar238 = ZEXT3264(local_520);
                    auVar237 = ZEXT3264(local_4e0);
                    auVar236 = ZEXT3264(local_500);
                    auVar100 = vxorps_avx512vl(auVar101,auVar101);
                    auVar239 = ZEXT1664(auVar100);
                    fVar192 = local_560;
                  }
                  auVar100 = auVar239._0_16_;
                  auVar76._8_8_ = uStack_5b8;
                  auVar76._0_8_ = local_5c0;
                  auVar76._16_8_ = uStack_5b0;
                  auVar76._24_8_ = uStack_5a8;
                  if (auVar76 == (undefined1  [32])0x0) {
LAB_01c14c5e:
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_320._0_4_;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar90->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_760);
                      uVar86 = CONCAT44(uStack_49c,local_4a0);
                      auVar230 = ZEXT1664(_local_6e0);
                      auVar235 = ZEXT3264(local_540);
                      auVar242 = ZEXT3264(local_620);
                      auVar241 = ZEXT3264(local_600);
                      auVar240 = ZEXT3264(local_5e0);
                      auVar243 = ZEXT3264(local_720);
                      auVar234 = ZEXT3264(local_700);
                      auVar238 = ZEXT3264(local_520);
                      auVar237 = ZEXT3264(local_4e0);
                      auVar236 = ZEXT3264(local_500);
                      auVar100 = vxorps_avx512vl(auVar100,auVar100);
                      auVar239 = ZEXT1664(auVar100);
                      fVar192 = local_560;
                    }
                    auVar77._8_8_ = uStack_5b8;
                    auVar77._0_8_ = local_5c0;
                    auVar77._16_8_ = uStack_5b0;
                    auVar77._24_8_ = uStack_5a8;
                    if (auVar77 == (undefined1  [32])0x0) goto LAB_01c14c5e;
                    uVar28 = vptestmd_avx512vl(auVar77,auVar77);
                    iVar1 = *(int *)(local_760.hit + 4);
                    iVar2 = *(int *)(local_760.hit + 8);
                    iVar69 = *(int *)(local_760.hit + 0xc);
                    iVar70 = *(int *)(local_760.hit + 0x10);
                    iVar71 = *(int *)(local_760.hit + 0x14);
                    iVar72 = *(int *)(local_760.hit + 0x18);
                    iVar73 = *(int *)(local_760.hit + 0x1c);
                    bVar85 = (byte)uVar28;
                    bVar13 = (bool)((byte)(uVar28 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar28 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar28 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar28 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar28 >> 6) & 1);
                    bVar19 = SUB81(uVar28 >> 7,0);
                    *(uint *)(local_760.ray + 0x180) =
                         (uint)(bVar85 & 1) * *(int *)local_760.hit |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_760.ray + 0x180);
                    *(uint *)(local_760.ray + 0x184) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x184);
                    *(uint *)(local_760.ray + 0x188) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x188);
                    *(uint *)(local_760.ray + 0x18c) =
                         (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_760.ray + 0x18c);
                    *(uint *)(local_760.ray + 400) =
                         (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_760.ray + 400);
                    *(uint *)(local_760.ray + 0x194) =
                         (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_760.ray + 0x194);
                    *(uint *)(local_760.ray + 0x198) =
                         (uint)bVar18 * iVar72 | (uint)!bVar18 * *(int *)(local_760.ray + 0x198);
                    *(uint *)(local_760.ray + 0x19c) =
                         (uint)bVar19 * iVar73 | (uint)!bVar19 * *(int *)(local_760.ray + 0x19c);
                    iVar1 = *(int *)(local_760.hit + 0x24);
                    iVar2 = *(int *)(local_760.hit + 0x28);
                    iVar69 = *(int *)(local_760.hit + 0x2c);
                    iVar70 = *(int *)(local_760.hit + 0x30);
                    iVar71 = *(int *)(local_760.hit + 0x34);
                    iVar72 = *(int *)(local_760.hit + 0x38);
                    iVar73 = *(int *)(local_760.hit + 0x3c);
                    bVar13 = (bool)((byte)(uVar28 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar28 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar28 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar28 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar28 >> 6) & 1);
                    bVar19 = SUB81(uVar28 >> 7,0);
                    *(uint *)(local_760.ray + 0x1a0) =
                         (uint)(bVar85 & 1) * *(int *)(local_760.hit + 0x20) |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_760.ray + 0x1a0);
                    *(uint *)(local_760.ray + 0x1a4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x1a4);
                    *(uint *)(local_760.ray + 0x1a8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x1a8);
                    *(uint *)(local_760.ray + 0x1ac) =
                         (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_760.ray + 0x1ac);
                    *(uint *)(local_760.ray + 0x1b0) =
                         (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_760.ray + 0x1b0);
                    *(uint *)(local_760.ray + 0x1b4) =
                         (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_760.ray + 0x1b4);
                    *(uint *)(local_760.ray + 0x1b8) =
                         (uint)bVar18 * iVar72 | (uint)!bVar18 * *(int *)(local_760.ray + 0x1b8);
                    *(uint *)(local_760.ray + 0x1bc) =
                         (uint)bVar19 * iVar73 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1bc);
                    iVar1 = *(int *)(local_760.hit + 0x44);
                    iVar2 = *(int *)(local_760.hit + 0x48);
                    iVar69 = *(int *)(local_760.hit + 0x4c);
                    iVar70 = *(int *)(local_760.hit + 0x50);
                    iVar71 = *(int *)(local_760.hit + 0x54);
                    iVar72 = *(int *)(local_760.hit + 0x58);
                    iVar73 = *(int *)(local_760.hit + 0x5c);
                    bVar13 = (bool)((byte)(uVar28 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar28 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar28 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar28 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar28 >> 6) & 1);
                    bVar19 = SUB81(uVar28 >> 7,0);
                    *(uint *)(local_760.ray + 0x1c0) =
                         (uint)(bVar85 & 1) * *(int *)(local_760.hit + 0x40) |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_760.ray + 0x1c0);
                    *(uint *)(local_760.ray + 0x1c4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x1c4);
                    *(uint *)(local_760.ray + 0x1c8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x1c8);
                    *(uint *)(local_760.ray + 0x1cc) =
                         (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_760.ray + 0x1cc);
                    *(uint *)(local_760.ray + 0x1d0) =
                         (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_760.ray + 0x1d0);
                    *(uint *)(local_760.ray + 0x1d4) =
                         (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_760.ray + 0x1d4);
                    *(uint *)(local_760.ray + 0x1d8) =
                         (uint)bVar18 * iVar72 | (uint)!bVar18 * *(int *)(local_760.ray + 0x1d8);
                    *(uint *)(local_760.ray + 0x1dc) =
                         (uint)bVar19 * iVar73 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1dc);
                    iVar1 = *(int *)(local_760.hit + 100);
                    iVar2 = *(int *)(local_760.hit + 0x68);
                    iVar69 = *(int *)(local_760.hit + 0x6c);
                    iVar70 = *(int *)(local_760.hit + 0x70);
                    iVar71 = *(int *)(local_760.hit + 0x74);
                    iVar72 = *(int *)(local_760.hit + 0x78);
                    iVar73 = *(int *)(local_760.hit + 0x7c);
                    bVar13 = (bool)((byte)(uVar28 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar28 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar28 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar28 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar28 >> 6) & 1);
                    bVar19 = SUB81(uVar28 >> 7,0);
                    *(uint *)(local_760.ray + 0x1e0) =
                         (uint)(bVar85 & 1) * *(int *)(local_760.hit + 0x60) |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_760.ray + 0x1e0);
                    *(uint *)(local_760.ray + 0x1e4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x1e4);
                    *(uint *)(local_760.ray + 0x1e8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x1e8);
                    *(uint *)(local_760.ray + 0x1ec) =
                         (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_760.ray + 0x1ec);
                    *(uint *)(local_760.ray + 0x1f0) =
                         (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_760.ray + 0x1f0);
                    *(uint *)(local_760.ray + 500) =
                         (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_760.ray + 500);
                    *(uint *)(local_760.ray + 0x1f8) =
                         (uint)bVar18 * iVar72 | (uint)!bVar18 * *(int *)(local_760.ray + 0x1f8);
                    *(uint *)(local_760.ray + 0x1fc) =
                         (uint)bVar19 * iVar73 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1fc);
                    auVar144._0_4_ =
                         (uint)(bVar85 & 1) * *(int *)(local_760.hit + 0x80) |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_760.ray + 0x200);
                    bVar13 = (bool)((byte)(uVar28 >> 1) & 1);
                    auVar144._4_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x84) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x204);
                    bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                    auVar144._8_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x88) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x208);
                    bVar13 = (bool)((byte)(uVar28 >> 3) & 1);
                    auVar144._12_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x8c) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x20c);
                    bVar13 = (bool)((byte)(uVar28 >> 4) & 1);
                    auVar144._16_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x90) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x210);
                    bVar13 = (bool)((byte)(uVar28 >> 5) & 1);
                    auVar144._20_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x94) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x214);
                    bVar13 = (bool)((byte)(uVar28 >> 6) & 1);
                    auVar144._24_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x98) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x218);
                    bVar13 = SUB81(uVar28 >> 7,0);
                    auVar144._28_4_ =
                         (uint)bVar13 * *(int *)(local_760.hit + 0x9c) |
                         (uint)!bVar13 * *(int *)(local_760.ray + 0x21c);
                    *(undefined1 (*) [32])(local_760.ray + 0x200) = auVar144;
                    auVar120 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xa0));
                    *(undefined1 (*) [32])(local_760.ray + 0x220) = auVar120;
                    auVar120 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xc0));
                    *(undefined1 (*) [32])(local_760.ray + 0x240) = auVar120;
                    auVar120 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xe0));
                    *(undefined1 (*) [32])(local_760.ray + 0x260) = auVar120;
                    auVar120 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0x100));
                    *(undefined1 (*) [32])(local_760.ray + 0x280) = auVar120;
                  }
                  auVar110 = auVar235._0_32_;
                  bVar85 = ~(byte)(1 << ((uint)uVar86 & 0x1f)) & bVar93;
                  uVar153 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar43._4_4_ = uVar153;
                  auVar43._0_4_ = uVar153;
                  auVar43._8_4_ = uVar153;
                  auVar43._12_4_ = uVar153;
                  auVar43._16_4_ = uVar153;
                  auVar43._20_4_ = uVar153;
                  auVar43._24_4_ = uVar153;
                  auVar43._28_4_ = uVar153;
                  uVar154 = vcmpps_avx512vl(local_660,auVar43,2);
                  bVar93 = bVar85 & (byte)uVar154;
                  if ((bVar85 & (byte)uVar154) != 0) {
                    auVar168._8_4_ = 0x7f800000;
                    auVar168._0_8_ = 0x7f8000007f800000;
                    auVar168._12_4_ = 0x7f800000;
                    auVar168._16_4_ = 0x7f800000;
                    auVar168._20_4_ = 0x7f800000;
                    auVar168._24_4_ = 0x7f800000;
                    auVar168._28_4_ = 0x7f800000;
                    auVar120 = vblendmps_avx512vl(auVar168,local_660);
                    auVar145._0_4_ =
                         (uint)(bVar93 & 1) * auVar120._0_4_ |
                         (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar93 >> 1 & 1);
                    auVar145._4_4_ = (uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar93 >> 2 & 1);
                    auVar145._8_4_ = (uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar93 >> 3 & 1);
                    auVar145._12_4_ = (uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar93 >> 4 & 1);
                    auVar145._16_4_ = (uint)bVar13 * auVar120._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar93 >> 5 & 1);
                    auVar145._20_4_ = (uint)bVar13 * auVar120._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar93 >> 6 & 1);
                    auVar145._24_4_ = (uint)bVar13 * auVar120._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar145._28_4_ =
                         (uint)(bVar93 >> 7) * auVar120._28_4_ |
                         (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
                    auVar120 = vshufps_avx(auVar145,auVar145,0xb1);
                    auVar120 = vminps_avx(auVar145,auVar120);
                    auVar122 = vshufpd_avx(auVar120,auVar120,5);
                    auVar120 = vminps_avx(auVar120,auVar122);
                    auVar122 = vpermpd_avx2(auVar120,0x4e);
                    auVar120 = vminps_avx(auVar120,auVar122);
                    uVar154 = vcmpps_avx512vl(auVar145,auVar120,0);
                    bVar84 = (byte)uVar154 & bVar93;
                    bVar85 = bVar93;
                    if (bVar84 != 0) {
                      bVar85 = bVar84;
                    }
                    uVar29 = 0;
                    for (uVar87 = (uint)bVar85; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000
                        ) {
                      uVar29 = uVar29 + 1;
                    }
                    uVar86 = (ulong)uVar29;
                  }
                  fVar202 = auVar230._0_4_;
                } while (bVar93 != 0);
              }
            }
          }
        }
      }
      local_560 = fVar202;
      if (8 < iVar8) {
        auVar120 = vpbroadcastd_avx512vl();
        auVar230 = ZEXT3264(auVar120);
        fStack_470 = 1.0 / (float)local_480._0_4_;
        local_480._4_4_ = fStack_470;
        local_480._0_4_ = fStack_470;
        fStack_478 = fStack_470;
        fStack_474 = fStack_470;
        local_320 = vpbroadcastd_avx512vl();
        local_340 = vpbroadcastd_avx512vl();
        lVar88 = 8;
        fStack_55c = local_560;
        fStack_558 = local_560;
        fStack_554 = local_560;
        fStack_550 = local_560;
        fStack_54c = local_560;
        fStack_548 = local_560;
        fStack_544 = local_560;
        local_540 = auVar110;
        local_4a0 = fVar192;
        uStack_49c = fVar192;
        uStack_498 = fVar192;
        uStack_494 = fVar192;
        uStack_490 = fVar192;
        uStack_48c = fVar192;
        uStack_488 = fVar192;
        uStack_484 = fVar192;
        fStack_46c = fStack_470;
        fStack_468 = fStack_470;
        fStack_464 = fStack_470;
        do {
          auVar120 = vpbroadcastd_avx512vl();
          auVar105 = vpor_avx2(auVar120,_DAT_0205a920);
          uVar27 = vpcmpgtd_avx512vl(auVar230._0_32_,auVar105);
          auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 * 4 + lVar30);
          auVar122 = *(undefined1 (*) [32])(lVar30 + 0x2227768 + lVar88 * 4);
          auVar118 = *(undefined1 (*) [32])(lVar30 + 0x2227bec + lVar88 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar30 + 0x2228070 + lVar88 * 4);
          local_600 = auVar241._0_32_;
          auVar106 = vmulps_avx512vl(local_600,auVar117);
          local_620 = auVar242._0_32_;
          auVar116 = vmulps_avx512vl(local_620,auVar117);
          auVar50._4_4_ = auVar117._4_4_ * (float)local_e0._4_4_;
          auVar50._0_4_ = auVar117._0_4_ * (float)local_e0._0_4_;
          auVar50._8_4_ = auVar117._8_4_ * fStack_d8;
          auVar50._12_4_ = auVar117._12_4_ * fStack_d4;
          auVar50._16_4_ = auVar117._16_4_ * fStack_d0;
          auVar50._20_4_ = auVar117._20_4_ * fStack_cc;
          auVar50._24_4_ = auVar117._24_4_ * fStack_c8;
          auVar50._28_4_ = auVar105._28_4_;
          auVar125 = auVar243._0_32_;
          auVar105 = vfmadd231ps_avx512vl(auVar106,auVar118,auVar125);
          local_5e0 = auVar240._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar116,auVar118,local_5e0);
          auVar116 = vfmadd231ps_avx512vl(auVar50,auVar118,local_c0);
          auVar124 = auVar238._0_32_;
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar122,auVar124);
          auVar121 = auVar234._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar122,auVar121);
          auVar100 = vfmadd231ps_fma(auVar116,auVar122,local_a0);
          auVar123 = auVar236._0_32_;
          auVar109 = vfmadd231ps_avx512vl(auVar105,auVar120,auVar123);
          local_4e0 = auVar237._0_32_;
          auVar111 = vfmadd231ps_avx512vl(auVar106,auVar120,local_4e0);
          auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 * 4 + lVar30);
          auVar106 = *(undefined1 (*) [32])(lVar30 + 0x2229b88 + lVar88 * 4);
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar120,local_80);
          auVar116 = *(undefined1 (*) [32])(lVar30 + 0x222a00c + lVar88 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar30 + 0x222a490 + lVar88 * 4);
          auVar110 = vmulps_avx512vl(local_600,auVar107);
          auVar108 = vmulps_avx512vl(local_620,auVar107);
          auVar51._4_4_ = auVar107._4_4_ * (float)local_e0._4_4_;
          auVar51._0_4_ = auVar107._0_4_ * (float)local_e0._0_4_;
          auVar51._8_4_ = auVar107._8_4_ * fStack_d8;
          auVar51._12_4_ = auVar107._12_4_ * fStack_d4;
          auVar51._16_4_ = auVar107._16_4_ * fStack_d0;
          auVar51._20_4_ = auVar107._20_4_ * fStack_cc;
          auVar51._24_4_ = auVar107._24_4_ * fStack_c8;
          auVar51._28_4_ = uStack_c4;
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar116,auVar125);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar116,local_5e0);
          auVar112 = vfmadd231ps_avx512vl(auVar51,auVar116,local_c0);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar106,auVar124);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar121);
          auVar99 = vfmadd231ps_fma(auVar112,auVar106,local_a0);
          auVar112 = vfmadd231ps_avx512vl(auVar110,auVar105,auVar123);
          auVar113 = vfmadd231ps_avx512vl(auVar108,auVar105,local_4e0);
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar105,local_80);
          auVar114 = vmaxps_avx512vl(ZEXT1632(auVar100),ZEXT1632(auVar99));
          auVar110 = vsubps_avx(auVar112,auVar109);
          auVar108 = vsubps_avx(auVar113,auVar111);
          auVar115 = vmulps_avx512vl(auVar111,auVar110);
          auVar119 = vmulps_avx512vl(auVar109,auVar108);
          auVar115 = vsubps_avx512vl(auVar115,auVar119);
          auVar119 = vmulps_avx512vl(auVar108,auVar108);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar110,auVar110);
          auVar114 = vmulps_avx512vl(auVar114,auVar114);
          auVar114 = vmulps_avx512vl(auVar114,auVar119);
          auVar115 = vmulps_avx512vl(auVar115,auVar115);
          uVar154 = vcmpps_avx512vl(auVar115,auVar114,2);
          local_3b0 = (byte)uVar27 & (byte)uVar154;
          if (local_3b0 == 0) {
            auVar235 = ZEXT3264(auVar121);
            auVar243 = ZEXT3264(auVar125);
          }
          else {
            auVar107 = vmulps_avx512vl(local_540,auVar107);
            auVar116 = vfmadd213ps_avx512vl(auVar116,local_140,auVar107);
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_120,auVar116);
            auVar105 = vfmadd213ps_avx512vl(auVar105,local_100,auVar106);
            auVar117 = vmulps_avx512vl(local_540,auVar117);
            auVar118 = vfmadd213ps_avx512vl(auVar118,local_140,auVar117);
            auVar122 = vfmadd213ps_avx512vl(auVar122,local_120,auVar118);
            auVar106 = vfmadd213ps_avx512vl(auVar120,local_100,auVar122);
            auVar120 = *(undefined1 (*) [32])(lVar30 + 0x22284f4 + lVar88 * 4);
            auVar122 = *(undefined1 (*) [32])(lVar30 + 0x2228978 + lVar88 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar30 + 0x2228dfc + lVar88 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar30 + 0x2229280 + lVar88 * 4);
            auVar116 = vmulps_avx512vl(local_600,auVar117);
            auVar107 = vmulps_avx512vl(local_620,auVar117);
            auVar117 = vmulps_avx512vl(local_540,auVar117);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar118,auVar125);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar118,local_5e0);
            auVar118 = vfmadd231ps_avx512vl(auVar117,local_140,auVar118);
            auVar117 = vfmadd231ps_avx512vl(auVar116,auVar122,auVar124);
            auVar116 = vfmadd231ps_avx512vl(auVar107,auVar122,auVar121);
            auVar122 = vfmadd231ps_avx512vl(auVar118,local_120,auVar122);
            auVar117 = vfmadd231ps_avx512vl(auVar117,auVar120,auVar123);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar120,local_4e0);
            auVar107 = vfmadd231ps_avx512vl(auVar122,local_100,auVar120);
            auVar120 = *(undefined1 (*) [32])(lVar30 + 0x222a914 + lVar88 * 4);
            auVar122 = *(undefined1 (*) [32])(lVar30 + 0x222b21c + lVar88 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar30 + 0x222b6a0 + lVar88 * 4);
            auVar114 = vmulps_avx512vl(local_600,auVar118);
            auVar115 = vmulps_avx512vl(local_620,auVar118);
            auVar118 = vmulps_avx512vl(local_540,auVar118);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar122,auVar125);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar122,local_5e0);
            auVar118 = vfmadd231ps_avx512vl(auVar118,local_140,auVar122);
            auVar122 = *(undefined1 (*) [32])(lVar30 + 0x222ad98 + lVar88 * 4);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar122,auVar124);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar122,auVar121);
            auVar122 = vfmadd231ps_avx512vl(auVar118,local_120,auVar122);
            auVar118 = vfmadd231ps_avx512vl(auVar114,auVar120,auVar123);
            auVar114 = vfmadd231ps_avx512vl(auVar115,auVar120,local_4e0);
            auVar122 = vfmadd231ps_avx512vl(auVar122,local_100,auVar120);
            auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar117,auVar115);
            vandps_avx512vl(auVar116,auVar115);
            auVar120 = vmaxps_avx(auVar115,auVar115);
            vandps_avx512vl(auVar107,auVar115);
            auVar120 = vmaxps_avx(auVar120,auVar115);
            auVar82._4_4_ = fStack_55c;
            auVar82._0_4_ = local_560;
            auVar82._8_4_ = fStack_558;
            auVar82._12_4_ = fStack_554;
            auVar82._16_4_ = fStack_550;
            auVar82._20_4_ = fStack_54c;
            auVar82._24_4_ = fStack_548;
            auVar82._28_4_ = fStack_544;
            uVar86 = vcmpps_avx512vl(auVar120,auVar82,1);
            bVar13 = (bool)((byte)uVar86 & 1);
            auVar132._0_4_ = (float)((uint)bVar13 * auVar110._0_4_ | (uint)!bVar13 * auVar117._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar117._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar117._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar117._12_4_);
            bVar13 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar132._16_4_ =
                 (float)((uint)bVar13 * auVar110._16_4_ | (uint)!bVar13 * auVar117._16_4_);
            bVar13 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar132._20_4_ =
                 (float)((uint)bVar13 * auVar110._20_4_ | (uint)!bVar13 * auVar117._20_4_);
            bVar13 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar132._24_4_ =
                 (float)((uint)bVar13 * auVar110._24_4_ | (uint)!bVar13 * auVar117._24_4_);
            bVar13 = SUB81(uVar86 >> 7,0);
            auVar132._28_4_ = (uint)bVar13 * auVar110._28_4_ | (uint)!bVar13 * auVar117._28_4_;
            bVar13 = (bool)((byte)uVar86 & 1);
            auVar133._0_4_ = (float)((uint)bVar13 * auVar108._0_4_ | (uint)!bVar13 * auVar116._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar116._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar116._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar116._12_4_);
            bVar13 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar133._16_4_ =
                 (float)((uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * auVar116._16_4_);
            bVar13 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar133._20_4_ =
                 (float)((uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * auVar116._20_4_);
            bVar13 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar133._24_4_ =
                 (float)((uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * auVar116._24_4_);
            bVar13 = SUB81(uVar86 >> 7,0);
            auVar133._28_4_ = (uint)bVar13 * auVar108._28_4_ | (uint)!bVar13 * auVar116._28_4_;
            vandps_avx512vl(auVar118,auVar115);
            vandps_avx512vl(auVar114,auVar115);
            auVar120 = vmaxps_avx(auVar133,auVar133);
            vandps_avx512vl(auVar122,auVar115);
            auVar120 = vmaxps_avx(auVar120,auVar133);
            uVar86 = vcmpps_avx512vl(auVar120,auVar82,1);
            bVar13 = (bool)((byte)uVar86 & 1);
            auVar134._0_4_ = (uint)bVar13 * auVar110._0_4_ | (uint)!bVar13 * auVar118._0_4_;
            bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar118._4_4_;
            bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar118._8_4_;
            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar118._12_4_;
            bVar13 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar134._16_4_ = (uint)bVar13 * auVar110._16_4_ | (uint)!bVar13 * auVar118._16_4_;
            bVar13 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar134._20_4_ = (uint)bVar13 * auVar110._20_4_ | (uint)!bVar13 * auVar118._20_4_;
            bVar13 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar134._24_4_ = (uint)bVar13 * auVar110._24_4_ | (uint)!bVar13 * auVar118._24_4_;
            bVar13 = SUB81(uVar86 >> 7,0);
            auVar134._28_4_ = (uint)bVar13 * auVar110._28_4_ | (uint)!bVar13 * auVar118._28_4_;
            bVar13 = (bool)((byte)uVar86 & 1);
            auVar135._0_4_ = (float)((uint)bVar13 * auVar108._0_4_ | (uint)!bVar13 * auVar114._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar114._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar114._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar114._12_4_);
            bVar13 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar135._16_4_ =
                 (float)((uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * auVar114._16_4_);
            bVar13 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar135._20_4_ =
                 (float)((uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * auVar114._20_4_);
            bVar13 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar135._24_4_ =
                 (float)((uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * auVar114._24_4_);
            bVar13 = SUB81(uVar86 >> 7,0);
            auVar135._28_4_ = (uint)bVar13 * auVar108._28_4_ | (uint)!bVar13 * auVar114._28_4_;
            auVar224._8_4_ = 0x80000000;
            auVar224._0_8_ = 0x8000000080000000;
            auVar224._12_4_ = 0x80000000;
            auVar224._16_4_ = 0x80000000;
            auVar224._20_4_ = 0x80000000;
            auVar224._24_4_ = 0x80000000;
            auVar224._28_4_ = 0x80000000;
            auVar120 = vxorps_avx512vl(auVar134,auVar224);
            auVar114 = auVar239._0_32_;
            auVar122 = vfmadd213ps_avx512vl(auVar132,auVar132,auVar114);
            auVar101 = vfmadd231ps_fma(auVar122,auVar133,auVar133);
            auVar122 = vrsqrt14ps_avx512vl(ZEXT1632(auVar101));
            auVar233._8_4_ = 0xbf000000;
            auVar233._0_8_ = 0xbf000000bf000000;
            auVar233._12_4_ = 0xbf000000;
            auVar233._16_4_ = 0xbf000000;
            auVar233._20_4_ = 0xbf000000;
            auVar233._24_4_ = 0xbf000000;
            auVar233._28_4_ = 0xbf000000;
            fVar192 = auVar122._0_4_;
            fVar202 = auVar122._4_4_;
            fVar191 = auVar122._8_4_;
            fVar201 = auVar122._12_4_;
            fVar203 = auVar122._16_4_;
            fVar204 = auVar122._20_4_;
            fVar182 = auVar122._24_4_;
            auVar52._4_4_ = fVar202 * fVar202 * fVar202 * auVar101._4_4_ * -0.5;
            auVar52._0_4_ = fVar192 * fVar192 * fVar192 * auVar101._0_4_ * -0.5;
            auVar52._8_4_ = fVar191 * fVar191 * fVar191 * auVar101._8_4_ * -0.5;
            auVar52._12_4_ = fVar201 * fVar201 * fVar201 * auVar101._12_4_ * -0.5;
            auVar52._16_4_ = fVar203 * fVar203 * fVar203 * -0.0;
            auVar52._20_4_ = fVar204 * fVar204 * fVar204 * -0.0;
            auVar52._24_4_ = fVar182 * fVar182 * fVar182 * -0.0;
            auVar52._28_4_ = auVar133._28_4_;
            auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar122 = vfmadd231ps_avx512vl(auVar52,auVar118,auVar122);
            auVar53._4_4_ = auVar133._4_4_ * auVar122._4_4_;
            auVar53._0_4_ = auVar133._0_4_ * auVar122._0_4_;
            auVar53._8_4_ = auVar133._8_4_ * auVar122._8_4_;
            auVar53._12_4_ = auVar133._12_4_ * auVar122._12_4_;
            auVar53._16_4_ = auVar133._16_4_ * auVar122._16_4_;
            auVar53._20_4_ = auVar133._20_4_ * auVar122._20_4_;
            auVar53._24_4_ = auVar133._24_4_ * auVar122._24_4_;
            auVar53._28_4_ = 0;
            auVar54._4_4_ = auVar122._4_4_ * -auVar132._4_4_;
            auVar54._0_4_ = auVar122._0_4_ * -auVar132._0_4_;
            auVar54._8_4_ = auVar122._8_4_ * -auVar132._8_4_;
            auVar54._12_4_ = auVar122._12_4_ * -auVar132._12_4_;
            auVar54._16_4_ = auVar122._16_4_ * -auVar132._16_4_;
            auVar54._20_4_ = auVar122._20_4_ * -auVar132._20_4_;
            auVar54._24_4_ = auVar122._24_4_ * -auVar132._24_4_;
            auVar54._28_4_ = auVar133._28_4_;
            auVar117 = vmulps_avx512vl(auVar122,auVar114);
            auVar122 = vfmadd213ps_avx512vl(auVar134,auVar134,auVar114);
            auVar122 = vfmadd231ps_avx512vl(auVar122,auVar135,auVar135);
            auVar116 = vrsqrt14ps_avx512vl(auVar122);
            auVar122 = vmulps_avx512vl(auVar122,auVar233);
            fVar192 = auVar116._0_4_;
            fVar202 = auVar116._4_4_;
            fVar191 = auVar116._8_4_;
            fVar201 = auVar116._12_4_;
            fVar203 = auVar116._16_4_;
            fVar204 = auVar116._20_4_;
            fVar182 = auVar116._24_4_;
            auVar55._4_4_ = fVar202 * fVar202 * fVar202 * auVar122._4_4_;
            auVar55._0_4_ = fVar192 * fVar192 * fVar192 * auVar122._0_4_;
            auVar55._8_4_ = fVar191 * fVar191 * fVar191 * auVar122._8_4_;
            auVar55._12_4_ = fVar201 * fVar201 * fVar201 * auVar122._12_4_;
            auVar55._16_4_ = fVar203 * fVar203 * fVar203 * auVar122._16_4_;
            auVar55._20_4_ = fVar204 * fVar204 * fVar204 * auVar122._20_4_;
            auVar55._24_4_ = fVar182 * fVar182 * fVar182 * auVar122._24_4_;
            auVar55._28_4_ = auVar122._28_4_;
            auVar122 = vfmadd231ps_avx512vl(auVar55,auVar118,auVar116);
            auVar56._4_4_ = auVar135._4_4_ * auVar122._4_4_;
            auVar56._0_4_ = auVar135._0_4_ * auVar122._0_4_;
            auVar56._8_4_ = auVar135._8_4_ * auVar122._8_4_;
            auVar56._12_4_ = auVar135._12_4_ * auVar122._12_4_;
            auVar56._16_4_ = auVar135._16_4_ * auVar122._16_4_;
            auVar56._20_4_ = auVar135._20_4_ * auVar122._20_4_;
            auVar56._24_4_ = auVar135._24_4_ * auVar122._24_4_;
            auVar56._28_4_ = auVar116._28_4_;
            auVar57._4_4_ = auVar122._4_4_ * auVar120._4_4_;
            auVar57._0_4_ = auVar122._0_4_ * auVar120._0_4_;
            auVar57._8_4_ = auVar122._8_4_ * auVar120._8_4_;
            auVar57._12_4_ = auVar122._12_4_ * auVar120._12_4_;
            auVar57._16_4_ = auVar122._16_4_ * auVar120._16_4_;
            auVar57._20_4_ = auVar122._20_4_ * auVar120._20_4_;
            auVar57._24_4_ = auVar122._24_4_ * auVar120._24_4_;
            auVar57._28_4_ = auVar120._28_4_;
            auVar120 = vmulps_avx512vl(auVar122,auVar114);
            auVar101 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar100),auVar109);
            auVar122 = ZEXT1632(auVar100);
            auVar21 = vfmadd213ps_fma(auVar54,auVar122,auVar111);
            auVar118 = vfmadd213ps_avx512vl(auVar117,auVar122,auVar106);
            auVar116 = vfmadd213ps_avx512vl(auVar56,ZEXT1632(auVar99),auVar112);
            auVar26 = vfnmadd213ps_fma(auVar53,auVar122,auVar109);
            auVar107 = ZEXT1632(auVar99);
            auVar22 = vfmadd213ps_fma(auVar57,auVar107,auVar113);
            auVar102 = vfnmadd213ps_fma(auVar54,auVar122,auVar111);
            auVar23 = vfmadd213ps_fma(auVar120,auVar107,auVar105);
            auVar111 = ZEXT1632(auVar100);
            auVar104 = vfnmadd231ps_fma(auVar106,auVar111,auVar117);
            auVar103 = vfnmadd213ps_fma(auVar56,auVar107,auVar112);
            auVar32 = vfnmadd213ps_fma(auVar57,auVar107,auVar113);
            auVar31 = vfnmadd231ps_fma(auVar105,ZEXT1632(auVar99),auVar120);
            auVar105 = vsubps_avx512vl(auVar116,ZEXT1632(auVar26));
            auVar120 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar102));
            auVar122 = vsubps_avx(ZEXT1632(auVar23),ZEXT1632(auVar104));
            auVar58._4_4_ = auVar120._4_4_ * auVar104._4_4_;
            auVar58._0_4_ = auVar120._0_4_ * auVar104._0_4_;
            auVar58._8_4_ = auVar120._8_4_ * auVar104._8_4_;
            auVar58._12_4_ = auVar120._12_4_ * auVar104._12_4_;
            auVar58._16_4_ = auVar120._16_4_ * 0.0;
            auVar58._20_4_ = auVar120._20_4_ * 0.0;
            auVar58._24_4_ = auVar120._24_4_ * 0.0;
            auVar58._28_4_ = auVar117._28_4_;
            auVar100 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar102),auVar122);
            auVar59._4_4_ = auVar122._4_4_ * auVar26._4_4_;
            auVar59._0_4_ = auVar122._0_4_ * auVar26._0_4_;
            auVar59._8_4_ = auVar122._8_4_ * auVar26._8_4_;
            auVar59._12_4_ = auVar122._12_4_ * auVar26._12_4_;
            auVar59._16_4_ = auVar122._16_4_ * 0.0;
            auVar59._20_4_ = auVar122._20_4_ * 0.0;
            auVar59._24_4_ = auVar122._24_4_ * 0.0;
            auVar59._28_4_ = auVar122._28_4_;
            auVar24 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar104),auVar105);
            auVar60._4_4_ = auVar102._4_4_ * auVar105._4_4_;
            auVar60._0_4_ = auVar102._0_4_ * auVar105._0_4_;
            auVar60._8_4_ = auVar102._8_4_ * auVar105._8_4_;
            auVar60._12_4_ = auVar102._12_4_ * auVar105._12_4_;
            auVar60._16_4_ = auVar105._16_4_ * 0.0;
            auVar60._20_4_ = auVar105._20_4_ * 0.0;
            auVar60._24_4_ = auVar105._24_4_ * 0.0;
            auVar60._28_4_ = auVar105._28_4_;
            auVar25 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar26),auVar120);
            auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar25),auVar114,ZEXT1632(auVar24));
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar114,ZEXT1632(auVar100));
            uVar86 = vcmpps_avx512vl(auVar120,auVar114,2);
            bVar93 = (byte)uVar86;
            fVar95 = (float)((uint)(bVar93 & 1) * auVar101._0_4_ |
                            (uint)!(bool)(bVar93 & 1) * auVar103._0_4_);
            bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
            fVar147 = (float)((uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar103._4_4_);
            bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
            fVar149 = (float)((uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar103._8_4_);
            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
            fVar151 = (float)((uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar103._12_4_);
            auVar107 = ZEXT1632(CONCAT412(fVar151,CONCAT48(fVar149,CONCAT44(fVar147,fVar95))));
            fVar146 = (float)((uint)(bVar93 & 1) * auVar21._0_4_ |
                             (uint)!(bool)(bVar93 & 1) * auVar32._0_4_);
            bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
            fVar148 = (float)((uint)bVar13 * auVar21._4_4_ | (uint)!bVar13 * auVar32._4_4_);
            bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
            fVar150 = (float)((uint)bVar13 * auVar21._8_4_ | (uint)!bVar13 * auVar32._8_4_);
            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
            fVar152 = (float)((uint)bVar13 * auVar21._12_4_ | (uint)!bVar13 * auVar32._12_4_);
            auVar110 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar150,CONCAT44(fVar148,fVar146))));
            auVar136._0_4_ =
                 (float)((uint)(bVar93 & 1) * auVar118._0_4_ |
                        (uint)!(bool)(bVar93 & 1) * auVar31._0_4_);
            bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * auVar31._4_4_);
            bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * auVar31._8_4_);
            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * auVar31._12_4_);
            fVar202 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar118._16_4_);
            auVar136._16_4_ = fVar202;
            fVar192 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar118._20_4_);
            auVar136._20_4_ = fVar192;
            fVar191 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar118._24_4_);
            auVar136._24_4_ = fVar191;
            iVar1 = (uint)(byte)(uVar86 >> 7) * auVar118._28_4_;
            auVar136._28_4_ = iVar1;
            auVar120 = vblendmps_avx512vl(ZEXT1632(auVar26),auVar116);
            auVar137._0_4_ =
                 (uint)(bVar93 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar93 & 1) * auVar100._0_4_;
            bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar137._4_4_ = (uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * auVar100._4_4_;
            bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar137._8_4_ = (uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * auVar100._8_4_;
            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar137._12_4_ = (uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * auVar100._12_4_;
            auVar137._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar120._16_4_;
            auVar137._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar120._20_4_;
            auVar137._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar120._24_4_;
            auVar137._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar120._28_4_;
            auVar120 = vblendmps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar22));
            auVar138._0_4_ =
                 (float)((uint)(bVar93 & 1) * auVar120._0_4_ |
                        (uint)!(bool)(bVar93 & 1) * auVar101._0_4_);
            bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar138._4_4_ = (float)((uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * auVar101._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar138._8_4_ = (float)((uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * auVar101._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar138._12_4_ =
                 (float)((uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * auVar101._12_4_);
            fVar204 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar120._16_4_);
            auVar138._16_4_ = fVar204;
            fVar203 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar120._20_4_);
            auVar138._20_4_ = fVar203;
            fVar201 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar120._24_4_);
            auVar138._24_4_ = fVar201;
            auVar138._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar120._28_4_;
            auVar120 = vblendmps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar23));
            auVar139._0_4_ =
                 (float)((uint)(bVar93 & 1) * auVar120._0_4_ |
                        (uint)!(bool)(bVar93 & 1) * auVar21._0_4_);
            bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * auVar21._4_4_);
            bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * auVar21._8_4_);
            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * auVar21._12_4_);
            fVar182 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar120._16_4_);
            auVar139._16_4_ = fVar182;
            fVar94 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar120._20_4_);
            auVar139._20_4_ = fVar94;
            fVar190 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar120._24_4_);
            auVar139._24_4_ = fVar190;
            iVar2 = (uint)(byte)(uVar86 >> 7) * auVar120._28_4_;
            auVar139._28_4_ = iVar2;
            auVar140._0_4_ =
                 (uint)(bVar93 & 1) * (int)auVar26._0_4_ |
                 (uint)!(bool)(bVar93 & 1) * auVar116._0_4_;
            bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar140._4_4_ = (uint)bVar13 * (int)auVar26._4_4_ | (uint)!bVar13 * auVar116._4_4_;
            bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar140._8_4_ = (uint)bVar13 * (int)auVar26._8_4_ | (uint)!bVar13 * auVar116._8_4_;
            bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar140._12_4_ = (uint)bVar13 * (int)auVar26._12_4_ | (uint)!bVar13 * auVar116._12_4_;
            auVar140._16_4_ = (uint)!(bool)((byte)(uVar86 >> 4) & 1) * auVar116._16_4_;
            auVar140._20_4_ = (uint)!(bool)((byte)(uVar86 >> 5) & 1) * auVar116._20_4_;
            auVar140._24_4_ = (uint)!(bool)((byte)(uVar86 >> 6) & 1) * auVar116._24_4_;
            auVar140._28_4_ = (uint)!SUB81(uVar86 >> 7,0) * auVar116._28_4_;
            bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar86 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar86 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar116 = vsubps_avx512vl(auVar140,auVar107);
            auVar122 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar102._12_4_ |
                                                     (uint)!bVar17 * auVar22._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar102._8_4_ |
                                                              (uint)!bVar15 * auVar22._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar102._4_4_ |
                                                                       (uint)!bVar13 * auVar22._4_4_
                                                                       ,(uint)(bVar93 & 1) *
                                                                        (int)auVar102._0_4_ |
                                                                        (uint)!(bool)(bVar93 & 1) *
                                                                        auVar22._0_4_)))),auVar110);
            auVar118 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar104._12_4_ |
                                                     (uint)!bVar18 * auVar23._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar104._8_4_ |
                                                              (uint)!bVar16 * auVar23._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar104._4_4_ |
                                                                       (uint)!bVar14 * auVar23._4_4_
                                                                       ,(uint)(bVar93 & 1) *
                                                                        (int)auVar104._0_4_ |
                                                                        (uint)!(bool)(bVar93 & 1) *
                                                                        auVar23._0_4_)))),auVar136);
            auVar117 = vsubps_avx(auVar107,auVar137);
            auVar105 = vsubps_avx(auVar110,auVar138);
            auVar106 = vsubps_avx(auVar136,auVar139);
            auVar61._4_4_ = auVar118._4_4_ * fVar147;
            auVar61._0_4_ = auVar118._0_4_ * fVar95;
            auVar61._8_4_ = auVar118._8_4_ * fVar149;
            auVar61._12_4_ = auVar118._12_4_ * fVar151;
            auVar61._16_4_ = auVar118._16_4_ * 0.0;
            auVar61._20_4_ = auVar118._20_4_ * 0.0;
            auVar61._24_4_ = auVar118._24_4_ * 0.0;
            auVar61._28_4_ = 0;
            auVar100 = vfmsub231ps_fma(auVar61,auVar136,auVar116);
            auVar189._0_4_ = fVar146 * auVar116._0_4_;
            auVar189._4_4_ = fVar148 * auVar116._4_4_;
            auVar189._8_4_ = fVar150 * auVar116._8_4_;
            auVar189._12_4_ = fVar152 * auVar116._12_4_;
            auVar189._16_4_ = auVar116._16_4_ * 0.0;
            auVar189._20_4_ = auVar116._20_4_ * 0.0;
            auVar189._24_4_ = auVar116._24_4_ * 0.0;
            auVar189._28_4_ = 0;
            auVar101 = vfmsub231ps_fma(auVar189,auVar107,auVar122);
            auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar114,ZEXT1632(auVar100));
            auVar197._0_4_ = auVar122._0_4_ * auVar136._0_4_;
            auVar197._4_4_ = auVar122._4_4_ * auVar136._4_4_;
            auVar197._8_4_ = auVar122._8_4_ * auVar136._8_4_;
            auVar197._12_4_ = auVar122._12_4_ * auVar136._12_4_;
            auVar197._16_4_ = auVar122._16_4_ * fVar202;
            auVar197._20_4_ = auVar122._20_4_ * fVar192;
            auVar197._24_4_ = auVar122._24_4_ * fVar191;
            auVar197._28_4_ = 0;
            auVar100 = vfmsub231ps_fma(auVar197,auVar110,auVar118);
            auVar108 = vfmadd231ps_avx512vl(auVar120,auVar114,ZEXT1632(auVar100));
            auVar120 = vmulps_avx512vl(auVar106,auVar137);
            auVar120 = vfmsub231ps_avx512vl(auVar120,auVar117,auVar139);
            auVar62._4_4_ = auVar105._4_4_ * auVar139._4_4_;
            auVar62._0_4_ = auVar105._0_4_ * auVar139._0_4_;
            auVar62._8_4_ = auVar105._8_4_ * auVar139._8_4_;
            auVar62._12_4_ = auVar105._12_4_ * auVar139._12_4_;
            auVar62._16_4_ = auVar105._16_4_ * fVar182;
            auVar62._20_4_ = auVar105._20_4_ * fVar94;
            auVar62._24_4_ = auVar105._24_4_ * fVar190;
            auVar62._28_4_ = iVar2;
            auVar100 = vfmsub231ps_fma(auVar62,auVar138,auVar106);
            auVar198._0_4_ = auVar138._0_4_ * auVar117._0_4_;
            auVar198._4_4_ = auVar138._4_4_ * auVar117._4_4_;
            auVar198._8_4_ = auVar138._8_4_ * auVar117._8_4_;
            auVar198._12_4_ = auVar138._12_4_ * auVar117._12_4_;
            auVar198._16_4_ = fVar204 * auVar117._16_4_;
            auVar198._20_4_ = fVar203 * auVar117._20_4_;
            auVar198._24_4_ = fVar201 * auVar117._24_4_;
            auVar198._28_4_ = 0;
            auVar101 = vfmsub231ps_fma(auVar198,auVar105,auVar137);
            auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar114,auVar120);
            auVar109 = vfmadd231ps_avx512vl(auVar120,auVar114,ZEXT1632(auVar100));
            auVar120 = vmaxps_avx(auVar108,auVar109);
            uVar154 = vcmpps_avx512vl(auVar120,auVar114,2);
            local_3b0 = local_3b0 & (byte)uVar154;
            if (local_3b0 == 0) {
LAB_01c142d2:
              local_3b0 = 0;
            }
            else {
              auVar63._4_4_ = auVar106._4_4_ * auVar122._4_4_;
              auVar63._0_4_ = auVar106._0_4_ * auVar122._0_4_;
              auVar63._8_4_ = auVar106._8_4_ * auVar122._8_4_;
              auVar63._12_4_ = auVar106._12_4_ * auVar122._12_4_;
              auVar63._16_4_ = auVar106._16_4_ * auVar122._16_4_;
              auVar63._20_4_ = auVar106._20_4_ * auVar122._20_4_;
              auVar63._24_4_ = auVar106._24_4_ * auVar122._24_4_;
              auVar63._28_4_ = auVar120._28_4_;
              auVar21 = vfmsub231ps_fma(auVar63,auVar105,auVar118);
              auVar64._4_4_ = auVar118._4_4_ * auVar117._4_4_;
              auVar64._0_4_ = auVar118._0_4_ * auVar117._0_4_;
              auVar64._8_4_ = auVar118._8_4_ * auVar117._8_4_;
              auVar64._12_4_ = auVar118._12_4_ * auVar117._12_4_;
              auVar64._16_4_ = auVar118._16_4_ * auVar117._16_4_;
              auVar64._20_4_ = auVar118._20_4_ * auVar117._20_4_;
              auVar64._24_4_ = auVar118._24_4_ * auVar117._24_4_;
              auVar64._28_4_ = auVar118._28_4_;
              auVar101 = vfmsub231ps_fma(auVar64,auVar116,auVar106);
              auVar65._4_4_ = auVar105._4_4_ * auVar116._4_4_;
              auVar65._0_4_ = auVar105._0_4_ * auVar116._0_4_;
              auVar65._8_4_ = auVar105._8_4_ * auVar116._8_4_;
              auVar65._12_4_ = auVar105._12_4_ * auVar116._12_4_;
              auVar65._16_4_ = auVar105._16_4_ * auVar116._16_4_;
              auVar65._20_4_ = auVar105._20_4_ * auVar116._20_4_;
              auVar65._24_4_ = auVar105._24_4_ * auVar116._24_4_;
              auVar65._28_4_ = auVar105._28_4_;
              auVar22 = vfmsub231ps_fma(auVar65,auVar117,auVar122);
              auVar100 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar101),ZEXT1632(auVar22));
              auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),ZEXT1632(auVar21),auVar114);
              auVar122 = vrcp14ps_avx512vl(auVar120);
              auVar38._8_4_ = 0x3f800000;
              auVar38._0_8_ = &DAT_3f8000003f800000;
              auVar38._12_4_ = 0x3f800000;
              auVar38._16_4_ = 0x3f800000;
              auVar38._20_4_ = 0x3f800000;
              auVar38._24_4_ = 0x3f800000;
              auVar38._28_4_ = 0x3f800000;
              auVar118 = vfnmadd213ps_avx512vl(auVar122,auVar120,auVar38);
              auVar100 = vfmadd132ps_fma(auVar118,auVar122,auVar122);
              auVar66._4_4_ = auVar22._4_4_ * auVar136._4_4_;
              auVar66._0_4_ = auVar22._0_4_ * auVar136._0_4_;
              auVar66._8_4_ = auVar22._8_4_ * auVar136._8_4_;
              auVar66._12_4_ = auVar22._12_4_ * auVar136._12_4_;
              auVar66._16_4_ = fVar202 * 0.0;
              auVar66._20_4_ = fVar192 * 0.0;
              auVar66._24_4_ = fVar191 * 0.0;
              auVar66._28_4_ = iVar1;
              auVar101 = vfmadd231ps_fma(auVar66,auVar110,ZEXT1632(auVar101));
              auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar107,ZEXT1632(auVar21));
              fVar192 = auVar100._0_4_;
              fVar202 = auVar100._4_4_;
              fVar191 = auVar100._8_4_;
              fVar201 = auVar100._12_4_;
              auVar122 = ZEXT1632(CONCAT412(auVar101._12_4_ * fVar201,
                                            CONCAT48(auVar101._8_4_ * fVar191,
                                                     CONCAT44(auVar101._4_4_ * fVar202,
                                                              auVar101._0_4_ * fVar192))));
              auVar83._4_4_ = uStack_49c;
              auVar83._0_4_ = local_4a0;
              auVar83._8_4_ = uStack_498;
              auVar83._12_4_ = uStack_494;
              auVar83._16_4_ = uStack_490;
              auVar83._20_4_ = uStack_48c;
              auVar83._24_4_ = uStack_488;
              auVar83._28_4_ = uStack_484;
              uVar154 = vcmpps_avx512vl(auVar122,auVar83,0xd);
              uVar153 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar39._4_4_ = uVar153;
              auVar39._0_4_ = uVar153;
              auVar39._8_4_ = uVar153;
              auVar39._12_4_ = uVar153;
              auVar39._16_4_ = uVar153;
              auVar39._20_4_ = uVar153;
              auVar39._24_4_ = uVar153;
              auVar39._28_4_ = uVar153;
              uVar27 = vcmpps_avx512vl(auVar122,auVar39,2);
              local_3b0 = (byte)uVar154 & (byte)uVar27 & local_3b0;
              if (local_3b0 == 0) goto LAB_01c142d2;
              uVar154 = vcmpps_avx512vl(auVar120,auVar114,4);
              if ((local_3b0 & (byte)uVar154) == 0) {
                local_3b0 = 0;
              }
              else {
                local_3b0 = local_3b0 & (byte)uVar154;
                fVar203 = auVar108._0_4_ * fVar192;
                fVar204 = auVar108._4_4_ * fVar202;
                auVar67._4_4_ = fVar204;
                auVar67._0_4_ = fVar203;
                fVar182 = auVar108._8_4_ * fVar191;
                auVar67._8_4_ = fVar182;
                fVar190 = auVar108._12_4_ * fVar201;
                auVar67._12_4_ = fVar190;
                fVar94 = auVar108._16_4_ * 0.0;
                auVar67._16_4_ = fVar94;
                fVar95 = auVar108._20_4_ * 0.0;
                auVar67._20_4_ = fVar95;
                fVar146 = auVar108._24_4_ * 0.0;
                auVar67._24_4_ = fVar146;
                auVar67._28_4_ = auVar108._28_4_;
                fVar192 = auVar109._0_4_ * fVar192;
                fVar202 = auVar109._4_4_ * fVar202;
                auVar68._4_4_ = fVar202;
                auVar68._0_4_ = fVar192;
                fVar191 = auVar109._8_4_ * fVar191;
                auVar68._8_4_ = fVar191;
                fVar201 = auVar109._12_4_ * fVar201;
                auVar68._12_4_ = fVar201;
                fVar147 = auVar109._16_4_ * 0.0;
                auVar68._16_4_ = fVar147;
                fVar148 = auVar109._20_4_ * 0.0;
                auVar68._20_4_ = fVar148;
                fVar149 = auVar109._24_4_ * 0.0;
                auVar68._24_4_ = fVar149;
                auVar68._28_4_ = auVar109._28_4_;
                auVar213._8_4_ = 0x3f800000;
                auVar213._0_8_ = &DAT_3f8000003f800000;
                auVar213._12_4_ = 0x3f800000;
                auVar213._16_4_ = 0x3f800000;
                auVar213._20_4_ = 0x3f800000;
                auVar213._24_4_ = 0x3f800000;
                auVar213._28_4_ = 0x3f800000;
                auVar120 = vsubps_avx(auVar213,auVar67);
                local_680._0_4_ =
                     (uint)(bVar93 & 1) * (int)fVar203 | (uint)!(bool)(bVar93 & 1) * auVar120._0_4_;
                bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
                local_680._4_4_ = (uint)bVar13 * (int)fVar204 | (uint)!bVar13 * auVar120._4_4_;
                bVar13 = (bool)((byte)(uVar86 >> 2) & 1);
                local_680._8_4_ = (uint)bVar13 * (int)fVar182 | (uint)!bVar13 * auVar120._8_4_;
                bVar13 = (bool)((byte)(uVar86 >> 3) & 1);
                local_680._12_4_ = (uint)bVar13 * (int)fVar190 | (uint)!bVar13 * auVar120._12_4_;
                bVar13 = (bool)((byte)(uVar86 >> 4) & 1);
                local_680._16_4_ = (uint)bVar13 * (int)fVar94 | (uint)!bVar13 * auVar120._16_4_;
                bVar13 = (bool)((byte)(uVar86 >> 5) & 1);
                local_680._20_4_ = (uint)bVar13 * (int)fVar95 | (uint)!bVar13 * auVar120._20_4_;
                bVar13 = (bool)((byte)(uVar86 >> 6) & 1);
                local_680._24_4_ = (uint)bVar13 * (int)fVar146 | (uint)!bVar13 * auVar120._24_4_;
                bVar13 = SUB81(uVar86 >> 7,0);
                local_680._28_4_ = (uint)bVar13 * auVar108._28_4_ | (uint)!bVar13 * auVar120._28_4_;
                auVar120 = vsubps_avx(auVar213,auVar68);
                bVar13 = (bool)((byte)(uVar86 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar86 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar86 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar86 >> 6) & 1);
                bVar19 = SUB81(uVar86 >> 7,0);
                local_300._4_4_ = (uint)bVar13 * (int)fVar202 | (uint)!bVar13 * auVar120._4_4_;
                local_300._0_4_ =
                     (uint)(bVar93 & 1) * (int)fVar192 | (uint)!(bool)(bVar93 & 1) * auVar120._0_4_;
                local_300._8_4_ = (uint)bVar14 * (int)fVar191 | (uint)!bVar14 * auVar120._8_4_;
                local_300._12_4_ = (uint)bVar15 * (int)fVar201 | (uint)!bVar15 * auVar120._12_4_;
                local_300._16_4_ = (uint)bVar16 * (int)fVar147 | (uint)!bVar16 * auVar120._16_4_;
                local_300._20_4_ = (uint)bVar17 * (int)fVar148 | (uint)!bVar17 * auVar120._20_4_;
                local_300._24_4_ = (uint)bVar18 * (int)fVar149 | (uint)!bVar18 * auVar120._24_4_;
                local_300._28_4_ = (uint)bVar19 * auVar109._28_4_ | (uint)!bVar19 * auVar120._28_4_;
                local_6a0 = auVar122;
              }
            }
            auVar243 = ZEXT3264(local_720);
            auVar235 = ZEXT3264(local_700);
            if (local_3b0 != 0) {
              auVar120 = vsubps_avx(ZEXT1632(auVar99),auVar111);
              auVar100 = vfmadd213ps_fma(auVar120,local_680,auVar111);
              uVar153 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar40._4_4_ = uVar153;
              auVar40._0_4_ = uVar153;
              auVar40._8_4_ = uVar153;
              auVar40._12_4_ = uVar153;
              auVar40._16_4_ = uVar153;
              auVar40._20_4_ = uVar153;
              auVar40._24_4_ = uVar153;
              auVar40._28_4_ = uVar153;
              auVar120 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar100._12_4_ + auVar100._12_4_,
                                                            CONCAT48(auVar100._8_4_ + auVar100._8_4_
                                                                     ,CONCAT44(auVar100._4_4_ +
                                                                               auVar100._4_4_,
                                                                               auVar100._0_4_ +
                                                                               auVar100._0_4_)))),
                                         auVar40);
              uVar154 = vcmpps_avx512vl(local_6a0,auVar120,6);
              local_3b0 = local_3b0 & (byte)uVar154;
              if (local_3b0 != 0) {
                auVar165._8_4_ = 0xbf800000;
                auVar165._0_8_ = 0xbf800000bf800000;
                auVar165._12_4_ = 0xbf800000;
                auVar165._16_4_ = 0xbf800000;
                auVar165._20_4_ = 0xbf800000;
                auVar165._24_4_ = 0xbf800000;
                auVar165._28_4_ = 0xbf800000;
                auVar41._8_4_ = 0x40000000;
                auVar41._0_8_ = 0x4000000040000000;
                auVar41._12_4_ = 0x40000000;
                auVar41._16_4_ = 0x40000000;
                auVar41._20_4_ = 0x40000000;
                auVar41._24_4_ = 0x40000000;
                auVar41._28_4_ = 0x40000000;
                local_440 = vfmadd132ps_avx512vl(local_300,auVar165,auVar41);
                local_300 = local_440;
                auVar120 = local_300;
                local_400 = (undefined4)lVar88;
                local_3f0 = local_770;
                uStack_3e8 = uStack_768;
                local_3e0 = local_6b0._0_8_;
                uStack_3d8 = local_6b0._8_8_;
                local_3d0 = local_6c0._0_8_;
                uStack_3c8 = local_6c0._8_8_;
                local_3c0 = local_6d0;
                uStack_3b8 = uStack_6c8;
                pGVar90 = (context->scene->geometries).items[uVar91].ptr;
                local_300 = auVar120;
                if ((pGVar90->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar100 = vcvtsi2ss_avx512f(auVar234._0_16_,local_400);
                  fVar192 = auVar100._0_4_;
                  local_3a0[0] = (fVar192 + local_680._0_4_ + 0.0) * (float)local_480._0_4_;
                  local_3a0[1] = (fVar192 + local_680._4_4_ + 1.0) * (float)local_480._4_4_;
                  local_3a0[2] = (fVar192 + local_680._8_4_ + 2.0) * fStack_478;
                  local_3a0[3] = (fVar192 + local_680._12_4_ + 3.0) * fStack_474;
                  fStack_390 = (fVar192 + local_680._16_4_ + 4.0) * fStack_470;
                  fStack_38c = (fVar192 + local_680._20_4_ + 5.0) * fStack_46c;
                  fStack_388 = (fVar192 + local_680._24_4_ + 6.0) * fStack_468;
                  fStack_384 = fVar192 + local_680._28_4_ + 7.0;
                  local_300._0_8_ = local_440._0_8_;
                  local_300._8_8_ = local_440._8_8_;
                  local_300._16_8_ = local_440._16_8_;
                  local_300._24_8_ = local_440._24_8_;
                  local_380 = local_300._0_8_;
                  uStack_378 = local_300._8_8_;
                  uStack_370 = local_300._16_8_;
                  uStack_368 = local_300._24_8_;
                  local_360 = local_6a0;
                  auVar166._8_4_ = 0x7f800000;
                  auVar166._0_8_ = 0x7f8000007f800000;
                  auVar166._12_4_ = 0x7f800000;
                  auVar166._16_4_ = 0x7f800000;
                  auVar166._20_4_ = 0x7f800000;
                  auVar166._24_4_ = 0x7f800000;
                  auVar166._28_4_ = 0x7f800000;
                  auVar120 = vblendmps_avx512vl(auVar166,local_6a0);
                  auVar141._0_4_ =
                       (uint)(local_3b0 & 1) * auVar120._0_4_ |
                       (uint)!(bool)(local_3b0 & 1) * 0x7f800000;
                  bVar13 = (bool)(local_3b0 >> 1 & 1);
                  auVar141._4_4_ = (uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_3b0 >> 2 & 1);
                  auVar141._8_4_ = (uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_3b0 >> 3 & 1);
                  auVar141._12_4_ = (uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_3b0 >> 4 & 1);
                  auVar141._16_4_ = (uint)bVar13 * auVar120._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_3b0 >> 5 & 1);
                  auVar141._20_4_ = (uint)bVar13 * auVar120._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_3b0 >> 6 & 1);
                  auVar141._24_4_ = (uint)bVar13 * auVar120._24_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar141._28_4_ =
                       (uint)(local_3b0 >> 7) * auVar120._28_4_ |
                       (uint)!(bool)(local_3b0 >> 7) * 0x7f800000;
                  auVar120 = vshufps_avx(auVar141,auVar141,0xb1);
                  auVar120 = vminps_avx(auVar141,auVar120);
                  auVar122 = vshufpd_avx(auVar120,auVar120,5);
                  auVar120 = vminps_avx(auVar120,auVar122);
                  auVar122 = vpermpd_avx2(auVar120,0x4e);
                  auVar120 = vminps_avx(auVar120,auVar122);
                  uVar154 = vcmpps_avx512vl(auVar141,auVar120,0);
                  bVar85 = (byte)uVar154 & local_3b0;
                  bVar93 = local_3b0;
                  if (bVar85 != 0) {
                    bVar93 = bVar85;
                  }
                  uVar29 = 0;
                  for (uVar87 = (uint)bVar93; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000)
                  {
                    uVar29 = uVar29 + 1;
                  }
                  uVar86 = (ulong)uVar29;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar90->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar192 = local_3a0[uVar86];
                    uVar153 = *(undefined4 *)((long)&local_380 + uVar86 * 4);
                    fVar191 = 1.0 - fVar192;
                    fVar202 = fVar191 * fVar191 * -3.0;
                    auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar191 * fVar191)),
                                               ZEXT416((uint)(fVar192 * fVar191)),
                                               ZEXT416(0xc0000000));
                    auVar99 = vfmsub132ss_fma(ZEXT416((uint)(fVar192 * fVar191)),
                                              ZEXT416((uint)(fVar192 * fVar192)),ZEXT416(0x40000000)
                                             );
                    fVar191 = auVar100._0_4_ * 3.0;
                    fVar201 = auVar99._0_4_ * 3.0;
                    fVar203 = fVar192 * fVar192 * 3.0;
                    auVar209._0_4_ = fVar203 * (float)local_6d0._0_4_;
                    auVar209._4_4_ = fVar203 * (float)local_6d0._4_4_;
                    auVar209._8_4_ = fVar203 * (float)uStack_6c8;
                    auVar209._12_4_ = fVar203 * uStack_6c8._4_4_;
                    auVar180._4_4_ = fVar201;
                    auVar180._0_4_ = fVar201;
                    auVar180._8_4_ = fVar201;
                    auVar180._12_4_ = fVar201;
                    auVar100 = vfmadd132ps_fma(auVar180,auVar209,local_6c0);
                    auVar186._4_4_ = fVar191;
                    auVar186._0_4_ = fVar191;
                    auVar186._8_4_ = fVar191;
                    auVar186._12_4_ = fVar191;
                    auVar100 = vfmadd132ps_fma(auVar186,auVar100,local_6b0);
                    auVar181._4_4_ = fVar202;
                    auVar181._0_4_ = fVar202;
                    auVar181._8_4_ = fVar202;
                    auVar181._12_4_ = fVar202;
                    auVar100 = vfmadd132ps_fma(auVar181,auVar100,auVar20);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + uVar86 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar100._0_4_;
                    uVar9 = vextractps_avx(auVar100,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                    uVar9 = vextractps_avx(auVar100,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar192;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar153;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar91;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_590 = local_6b0._0_8_;
                    uStack_588 = local_6b0._8_8_;
                    local_5a0 = local_6c0._0_4_;
                    fStack_59c = local_6c0._4_4_;
                    fStack_598 = local_6c0._8_4_;
                    fStack_594 = local_6c0._12_4_;
                    _local_6e0 = _local_6d0;
                    local_2a0 = vmovdqa64_avx512vl(auVar230._0_32_);
                    local_730 = pGVar90;
                    local_460 = local_680;
                    local_420 = local_6a0;
                    local_3fc = iVar8;
                    bVar93 = local_3b0;
                    do {
                      auVar122 = local_4c0;
                      auVar101 = auVar239._0_16_;
                      local_580 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_200 = local_3a0[uVar86];
                      local_1e0 = *(undefined4 *)((long)&local_380 + uVar86 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_360 + uVar86 * 4)
                      ;
                      local_760.context = context->user;
                      fVar202 = 1.0 - local_200;
                      fVar192 = fVar202 * fVar202 * -3.0;
                      auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * fVar202)),
                                                 ZEXT416((uint)(local_200 * fVar202)),
                                                 ZEXT416(0xc0000000));
                      auVar99 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar202)),
                                                ZEXT416((uint)(local_200 * local_200)),
                                                ZEXT416(0x40000000));
                      fVar202 = auVar100._0_4_ * 3.0;
                      fVar191 = auVar99._0_4_ * 3.0;
                      fVar201 = local_200 * local_200 * 3.0;
                      auVar210._0_4_ = fVar201 * (float)local_6e0._0_4_;
                      auVar210._4_4_ = fVar201 * (float)local_6e0._4_4_;
                      auVar210._8_4_ = fVar201 * fStack_6d8;
                      auVar210._12_4_ = fVar201 * fStack_6d4;
                      auVar159._4_4_ = fVar191;
                      auVar159._0_4_ = fVar191;
                      auVar159._8_4_ = fVar191;
                      auVar159._12_4_ = fVar191;
                      auVar78._4_4_ = fStack_59c;
                      auVar78._0_4_ = local_5a0;
                      auVar78._8_4_ = fStack_598;
                      auVar78._12_4_ = fStack_594;
                      auVar100 = vfmadd132ps_fma(auVar159,auVar210,auVar78);
                      auVar187._4_4_ = fVar202;
                      auVar187._0_4_ = fVar202;
                      auVar187._8_4_ = fVar202;
                      auVar187._12_4_ = fVar202;
                      auVar79._8_8_ = uStack_588;
                      auVar79._0_8_ = local_590;
                      auVar100 = vfmadd132ps_fma(auVar187,auVar100,auVar79);
                      auVar160._4_4_ = fVar192;
                      auVar160._0_4_ = fVar192;
                      auVar160._8_4_ = fVar192;
                      auVar160._12_4_ = fVar192;
                      auVar100 = vfmadd132ps_fma(auVar160,auVar100,auVar20);
                      local_260 = auVar100._0_4_;
                      auVar199._8_4_ = 1;
                      auVar199._0_8_ = 0x100000001;
                      auVar199._12_4_ = 1;
                      auVar199._16_4_ = 1;
                      auVar199._20_4_ = 1;
                      auVar199._24_4_ = 1;
                      auVar199._28_4_ = 1;
                      local_240 = vpermps_avx2(auVar199,ZEXT1632(auVar100));
                      auVar214._8_4_ = 2;
                      auVar214._0_8_ = 0x200000002;
                      auVar214._12_4_ = 2;
                      auVar214._16_4_ = 2;
                      auVar214._20_4_ = 2;
                      auVar214._24_4_ = 2;
                      auVar214._28_4_ = 2;
                      local_220 = vpermps_avx2(auVar214,ZEXT1632(auVar100));
                      iStack_25c = local_260;
                      iStack_258 = local_260;
                      iStack_254 = local_260;
                      iStack_250 = local_260;
                      iStack_24c = local_260;
                      iStack_248 = local_260;
                      iStack_244 = local_260;
                      fStack_1fc = local_200;
                      fStack_1f8 = local_200;
                      fStack_1f4 = local_200;
                      fStack_1f0 = local_200;
                      fStack_1ec = local_200;
                      fStack_1e8 = local_200;
                      fStack_1e4 = local_200;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_340._0_8_;
                      uStack_1b8 = local_340._8_8_;
                      uStack_1b0 = local_340._16_8_;
                      uStack_1a8 = local_340._24_8_;
                      local_1a0 = local_320;
                      auVar120 = vpcmpeqd_avx2(local_320,local_320);
                      local_728[1] = auVar120;
                      *local_728 = auVar120;
                      local_180 = (local_760.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_760.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_5c0 = local_280._0_8_;
                      uStack_5b8 = local_280._8_8_;
                      uStack_5b0 = local_280._16_8_;
                      uStack_5a8 = local_280._24_8_;
                      local_760.valid = (int *)&local_5c0;
                      local_760.geometryUserPtr = pGVar90->userPtr;
                      local_760.hit = (RTCHitN *)&local_260;
                      local_760.N = 8;
                      local_4c0._1_3_ = 0;
                      local_4c0[0] = bVar93;
                      local_4c0._4_28_ = auVar122._4_28_;
                      local_760.ray = (RTCRayN *)ray;
                      if (pGVar90->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar90->intersectionFilterN)(&local_760);
                        auVar120 = vmovdqa64_avx512vl(local_2a0);
                        auVar230 = ZEXT3264(auVar120);
                        auVar242 = ZEXT3264(local_620);
                        auVar241 = ZEXT3264(local_600);
                        auVar240 = ZEXT3264(local_5e0);
                        auVar243 = ZEXT3264(local_720);
                        auVar235 = ZEXT3264(local_700);
                        auVar238 = ZEXT3264(local_520);
                        auVar237 = ZEXT3264(local_4e0);
                        auVar236 = ZEXT3264(local_500);
                        auVar100 = vxorps_avx512vl(auVar101,auVar101);
                        auVar239 = ZEXT1664(auVar100);
                        pGVar90 = local_730;
                        bVar93 = local_4c0[0];
                      }
                      auVar100 = auVar239._0_16_;
                      auVar74._8_8_ = uStack_5b8;
                      auVar74._0_8_ = local_5c0;
                      auVar74._16_8_ = uStack_5b0;
                      auVar74._24_8_ = uStack_5a8;
                      if (auVar74 == (undefined1  [32])0x0) {
LAB_01c14735:
                        *(undefined4 *)(ray + k * 4 + 0x100) = local_580;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar90->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_760);
                          bVar93 = local_4c0[0];
                          auVar120 = vmovdqa64_avx512vl(local_2a0);
                          auVar230 = ZEXT3264(auVar120);
                          auVar242 = ZEXT3264(local_620);
                          auVar241 = ZEXT3264(local_600);
                          auVar240 = ZEXT3264(local_5e0);
                          auVar243 = ZEXT3264(local_720);
                          auVar235 = ZEXT3264(local_700);
                          auVar238 = ZEXT3264(local_520);
                          auVar237 = ZEXT3264(local_4e0);
                          auVar236 = ZEXT3264(local_500);
                          auVar100 = vxorps_avx512vl(auVar100,auVar100);
                          auVar239 = ZEXT1664(auVar100);
                          pGVar90 = local_730;
                        }
                        auVar75._8_8_ = uStack_5b8;
                        auVar75._0_8_ = local_5c0;
                        auVar75._16_8_ = uStack_5b0;
                        auVar75._24_8_ = uStack_5a8;
                        if (auVar75 == (undefined1  [32])0x0) goto LAB_01c14735;
                        uVar28 = vptestmd_avx512vl(auVar75,auVar75);
                        iVar1 = *(int *)(local_760.hit + 4);
                        iVar2 = *(int *)(local_760.hit + 8);
                        iVar69 = *(int *)(local_760.hit + 0xc);
                        iVar70 = *(int *)(local_760.hit + 0x10);
                        iVar71 = *(int *)(local_760.hit + 0x14);
                        iVar72 = *(int *)(local_760.hit + 0x18);
                        iVar73 = *(int *)(local_760.hit + 0x1c);
                        bVar85 = (byte)uVar28;
                        bVar13 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar19 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_760.ray + 0x180) =
                             (uint)(bVar85 & 1) * *(int *)local_760.hit |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_760.ray + 0x180);
                        *(uint *)(local_760.ray + 0x184) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x184);
                        *(uint *)(local_760.ray + 0x188) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x188);
                        *(uint *)(local_760.ray + 0x18c) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_760.ray + 0x18c)
                        ;
                        *(uint *)(local_760.ray + 400) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_760.ray + 400);
                        *(uint *)(local_760.ray + 0x194) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_760.ray + 0x194)
                        ;
                        *(uint *)(local_760.ray + 0x198) =
                             (uint)bVar18 * iVar72 | (uint)!bVar18 * *(int *)(local_760.ray + 0x198)
                        ;
                        *(uint *)(local_760.ray + 0x19c) =
                             (uint)bVar19 * iVar73 | (uint)!bVar19 * *(int *)(local_760.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_760.hit + 0x24);
                        iVar2 = *(int *)(local_760.hit + 0x28);
                        iVar69 = *(int *)(local_760.hit + 0x2c);
                        iVar70 = *(int *)(local_760.hit + 0x30);
                        iVar71 = *(int *)(local_760.hit + 0x34);
                        iVar72 = *(int *)(local_760.hit + 0x38);
                        iVar73 = *(int *)(local_760.hit + 0x3c);
                        bVar13 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar19 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_760.ray + 0x1a0) =
                             (uint)(bVar85 & 1) * *(int *)(local_760.hit + 0x20) |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_760.ray + 0x1a0);
                        *(uint *)(local_760.ray + 0x1a4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x1a4);
                        *(uint *)(local_760.ray + 0x1a8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x1a8);
                        *(uint *)(local_760.ray + 0x1ac) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_760.ray + 0x1ac)
                        ;
                        *(uint *)(local_760.ray + 0x1b0) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_760.ray + 0x1b0)
                        ;
                        *(uint *)(local_760.ray + 0x1b4) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_760.ray + 0x1b4)
                        ;
                        *(uint *)(local_760.ray + 0x1b8) =
                             (uint)bVar18 * iVar72 | (uint)!bVar18 * *(int *)(local_760.ray + 0x1b8)
                        ;
                        *(uint *)(local_760.ray + 0x1bc) =
                             (uint)bVar19 * iVar73 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_760.hit + 0x44);
                        iVar2 = *(int *)(local_760.hit + 0x48);
                        iVar69 = *(int *)(local_760.hit + 0x4c);
                        iVar70 = *(int *)(local_760.hit + 0x50);
                        iVar71 = *(int *)(local_760.hit + 0x54);
                        iVar72 = *(int *)(local_760.hit + 0x58);
                        iVar73 = *(int *)(local_760.hit + 0x5c);
                        bVar13 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar19 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_760.ray + 0x1c0) =
                             (uint)(bVar85 & 1) * *(int *)(local_760.hit + 0x40) |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_760.ray + 0x1c0);
                        *(uint *)(local_760.ray + 0x1c4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x1c4);
                        *(uint *)(local_760.ray + 0x1c8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x1c8);
                        *(uint *)(local_760.ray + 0x1cc) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_760.ray + 0x1cc)
                        ;
                        *(uint *)(local_760.ray + 0x1d0) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_760.ray + 0x1d0)
                        ;
                        *(uint *)(local_760.ray + 0x1d4) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_760.ray + 0x1d4)
                        ;
                        *(uint *)(local_760.ray + 0x1d8) =
                             (uint)bVar18 * iVar72 | (uint)!bVar18 * *(int *)(local_760.ray + 0x1d8)
                        ;
                        *(uint *)(local_760.ray + 0x1dc) =
                             (uint)bVar19 * iVar73 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_760.hit + 100);
                        iVar2 = *(int *)(local_760.hit + 0x68);
                        iVar69 = *(int *)(local_760.hit + 0x6c);
                        iVar70 = *(int *)(local_760.hit + 0x70);
                        iVar71 = *(int *)(local_760.hit + 0x74);
                        iVar72 = *(int *)(local_760.hit + 0x78);
                        iVar73 = *(int *)(local_760.hit + 0x7c);
                        bVar13 = (bool)((byte)(uVar28 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar28 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar28 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar28 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar28 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar28 >> 6) & 1);
                        bVar19 = SUB81(uVar28 >> 7,0);
                        *(uint *)(local_760.ray + 0x1e0) =
                             (uint)(bVar85 & 1) * *(int *)(local_760.hit + 0x60) |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_760.ray + 0x1e0);
                        *(uint *)(local_760.ray + 0x1e4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_760.ray + 0x1e4);
                        *(uint *)(local_760.ray + 0x1e8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_760.ray + 0x1e8);
                        *(uint *)(local_760.ray + 0x1ec) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_760.ray + 0x1ec)
                        ;
                        *(uint *)(local_760.ray + 0x1f0) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_760.ray + 0x1f0)
                        ;
                        *(uint *)(local_760.ray + 500) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_760.ray + 500);
                        *(uint *)(local_760.ray + 0x1f8) =
                             (uint)bVar18 * iVar72 | (uint)!bVar18 * *(int *)(local_760.ray + 0x1f8)
                        ;
                        *(uint *)(local_760.ray + 0x1fc) =
                             (uint)bVar19 * iVar73 | (uint)!bVar19 * *(int *)(local_760.ray + 0x1fc)
                        ;
                        auVar142._0_4_ =
                             (uint)(bVar85 & 1) * *(int *)(local_760.hit + 0x80) |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_760.ray + 0x200);
                        bVar13 = (bool)((byte)(uVar28 >> 1) & 1);
                        auVar142._4_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x84) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x204);
                        bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                        auVar142._8_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x88) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x208);
                        bVar13 = (bool)((byte)(uVar28 >> 3) & 1);
                        auVar142._12_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x8c) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x20c);
                        bVar13 = (bool)((byte)(uVar28 >> 4) & 1);
                        auVar142._16_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x90) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x210);
                        bVar13 = (bool)((byte)(uVar28 >> 5) & 1);
                        auVar142._20_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x94) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x214);
                        bVar13 = (bool)((byte)(uVar28 >> 6) & 1);
                        auVar142._24_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x98) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x218);
                        bVar13 = SUB81(uVar28 >> 7,0);
                        auVar142._28_4_ =
                             (uint)bVar13 * *(int *)(local_760.hit + 0x9c) |
                             (uint)!bVar13 * *(int *)(local_760.ray + 0x21c);
                        *(undefined1 (*) [32])(local_760.ray + 0x200) = auVar142;
                        auVar120 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xa0));
                        *(undefined1 (*) [32])(local_760.ray + 0x220) = auVar120;
                        auVar120 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xc0));
                        *(undefined1 (*) [32])(local_760.ray + 0x240) = auVar120;
                        auVar120 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0xe0));
                        *(undefined1 (*) [32])(local_760.ray + 0x260) = auVar120;
                        auVar120 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_760.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_760.ray + 0x280) = auVar120;
                      }
                      bVar85 = ~(byte)(1 << ((uint)uVar86 & 0x1f)) & bVar93;
                      uVar153 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar42._4_4_ = uVar153;
                      auVar42._0_4_ = uVar153;
                      auVar42._8_4_ = uVar153;
                      auVar42._12_4_ = uVar153;
                      auVar42._16_4_ = uVar153;
                      auVar42._20_4_ = uVar153;
                      auVar42._24_4_ = uVar153;
                      auVar42._28_4_ = uVar153;
                      uVar154 = vcmpps_avx512vl(local_6a0,auVar42,2);
                      bVar93 = bVar85 & (byte)uVar154;
                      if ((bVar85 & (byte)uVar154) != 0) {
                        auVar167._8_4_ = 0x7f800000;
                        auVar167._0_8_ = 0x7f8000007f800000;
                        auVar167._12_4_ = 0x7f800000;
                        auVar167._16_4_ = 0x7f800000;
                        auVar167._20_4_ = 0x7f800000;
                        auVar167._24_4_ = 0x7f800000;
                        auVar167._28_4_ = 0x7f800000;
                        auVar120 = vblendmps_avx512vl(auVar167,local_6a0);
                        auVar143._0_4_ =
                             (uint)(bVar93 & 1) * auVar120._0_4_ |
                             (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar93 >> 1 & 1);
                        auVar143._4_4_ = (uint)bVar13 * auVar120._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar93 >> 2 & 1);
                        auVar143._8_4_ = (uint)bVar13 * auVar120._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar93 >> 3 & 1);
                        auVar143._12_4_ =
                             (uint)bVar13 * auVar120._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar93 >> 4 & 1);
                        auVar143._16_4_ =
                             (uint)bVar13 * auVar120._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar93 >> 5 & 1);
                        auVar143._20_4_ =
                             (uint)bVar13 * auVar120._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar93 >> 6 & 1);
                        auVar143._24_4_ =
                             (uint)bVar13 * auVar120._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar143._28_4_ =
                             (uint)(bVar93 >> 7) * auVar120._28_4_ |
                             (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
                        auVar120 = vshufps_avx(auVar143,auVar143,0xb1);
                        auVar120 = vminps_avx(auVar143,auVar120);
                        auVar122 = vshufpd_avx(auVar120,auVar120,5);
                        auVar120 = vminps_avx(auVar120,auVar122);
                        auVar122 = vpermpd_avx2(auVar120,0x4e);
                        auVar120 = vminps_avx(auVar120,auVar122);
                        uVar154 = vcmpps_avx512vl(auVar143,auVar120,0);
                        bVar84 = (byte)uVar154 & bVar93;
                        bVar85 = bVar93;
                        if (bVar84 != 0) {
                          bVar85 = bVar84;
                        }
                        uVar29 = 0;
                        for (uVar87 = (uint)bVar85; (uVar87 & 1) == 0;
                            uVar87 = uVar87 >> 1 | 0x80000000) {
                          uVar29 = uVar29 + 1;
                        }
                        uVar86 = (ulong)uVar29;
                      }
                    } while (bVar93 != 0);
                  }
                }
              }
            }
          }
          lVar88 = lVar88 + 8;
          auVar234 = auVar235;
        } while ((int)lVar88 < iVar8);
      }
      uVar153 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar34._4_4_ = uVar153;
      auVar34._0_4_ = uVar153;
      auVar34._8_4_ = uVar153;
      auVar34._12_4_ = uVar153;
      uVar154 = vcmpps_avx512vl(local_2b0,auVar34,2);
      uVar91 = (uint)uVar92 & (uint)uVar92 + 0xf & (uint)uVar154;
      uVar92 = (ulong)uVar91;
    } while (uVar91 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }